

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O3

void in_memory_snapshot_test(void)

{
  void *pvVar1;
  long lVar2;
  void *pvVar3;
  fdb_doc *doc;
  fdb_status fVar4;
  int iVar5;
  fdb_status fVar6;
  fdb_status extraout_EAX;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  __atomic_base<unsigned_long> _Var10;
  char *handle;
  fdb_kvs_handle *pfVar11;
  fdb_kvs_handle *pfVar12;
  fdb_iterator *doc_00;
  fdb_kvs_handle *pfVar13;
  fdb_kvs_handle *pfVar14;
  fdb_kvs_handle *in_RCX;
  btree *extraout_RDX;
  char *pcVar15;
  fdb_kvs_handle *doc_01;
  uint uVar16;
  __atomic_base<unsigned_long> unaff_RBP;
  fdb_iterator *pfVar17;
  char *unaff_R12;
  fdb_kvs_handle *__s;
  char *unaff_R13;
  long lVar18;
  ulong uVar19;
  fdb_config *pfVar20;
  btree *__s_00;
  fdb_kvs_handle *unaff_R15;
  fdb_doc **ppfVar21;
  fdb_iterator *config;
  fdb_kvs_handle *db;
  fdb_kvs_handle *snap_db;
  fdb_file_handle *dbfile;
  fdb_iterator *iterator;
  fdb_doc *rdoc;
  fdb_kvs_info kvs_info;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  char keybuf [256];
  char metabuf [256];
  char bodybuf [256];
  fdb_config fconfig;
  fdb_doc *pfStack_17f0;
  fdb_iterator *pfStack_17e8;
  int iStack_17dc;
  fdb_kvs_handle *pfStack_17d8;
  timeval tStack_17d0;
  fdb_kvs_handle *pfStack_17c0;
  fdb_kvs_handle *pfStack_17b8;
  fdb_kvs_handle *pfStack_17b0;
  fdb_kvs_handle *pfStack_17a8;
  fdb_iterator *pfStack_17a0;
  fdb_iterator *pfStack_1798;
  fdb_kvs_handle *pfStack_1788;
  fdb_kvs_handle *pfStack_1780;
  undefined1 auStack_1778 [24];
  fdb_kvs_handle *pfStack_1760;
  fdb_kvs_handle *pfStack_1758;
  fdb_kvs_handle *pfStack_1750;
  fdb_kvs_handle *pfStack_1748;
  undefined1 auStack_1740 [80];
  undefined8 auStack_16f0 [5];
  fdb_doc *apfStack_16c8 [6];
  fdb_kvs_info fStack_1698;
  timeval tStack_1668;
  undefined1 auStack_1658 [280];
  fdb_iterator fStack_1540;
  fdb_kvs_handle fStack_1440;
  fdb_kvs_handle *pfStack_1238;
  btree *pbStack_1230;
  fdb_kvs_handle *pfStack_1228;
  code *pcStack_1220;
  fdb_iterator *pfStack_1210;
  fdb_kvs_handle *pfStack_1208;
  fdb_kvs_handle *pfStack_1200;
  fdb_kvs_handle *pfStack_11f8;
  atomic<unsigned_long> *paStack_11f0;
  size_t sStack_11e8;
  fdb_kvs_handle *pfStack_11e0;
  fdb_kvs_info fStack_11d8;
  undefined1 auStack_11a8 [14];
  undefined2 uStack_119a;
  undefined1 auStack_1198 [520];
  fdb_kvs_handle *pfStack_f90;
  fdb_kvs_handle *pfStack_f88;
  fdb_kvs_handle *pfStack_f80;
  fdb_kvs_handle *pfStack_f78;
  fdb_kvs_handle *pfStack_f70;
  fdb_kvs_handle *pfStack_f68;
  undefined1 auStack_f58 [8];
  fdb_file_handle *pfStack_f50;
  fdb_kvs_handle *pfStack_f48;
  fdb_kvs_handle *pfStack_f40;
  fdb_iterator *pfStack_f38;
  undefined1 auStack_f30 [48];
  undefined1 auStack_f00 [64];
  hbtrie *phStack_ec0;
  kvs_ops_stat *pkStack_eb8;
  timeval tStack_e90;
  btreeblk_handle *apbStack_e80 [33];
  undefined1 auStack_d78 [32];
  undefined2 uStack_d58;
  undefined1 uStack_d38;
  code *pcStack_d20;
  undefined4 uStack_d18;
  fdb_txn *pfStack_d10;
  fdb_kvs_handle *pfStack_c80;
  char acStack_c78 [256];
  fdb_kvs_handle *pfStack_b78;
  fdb_kvs_handle *pfStack_b70;
  fdb_kvs_handle *pfStack_b68;
  fdb_kvs_handle *pfStack_b60;
  fdb_kvs_handle *pfStack_b58;
  fdb_kvs_handle *pfStack_b50;
  fdb_kvs_handle *pfStack_b40;
  uint uStack_b34;
  fdb_iterator *pfStack_b30;
  fdb_kvs_handle *pfStack_b28;
  undefined4 *puStack_b20;
  fdb_kvs_handle *pfStack_b18;
  fdb_kvs_handle *pfStack_b10;
  fdb_iterator *pfStack_b08;
  fdb_file_handle *pfStack_b00;
  fdb_iterator *pfStack_af8;
  size_t sStack_af0;
  undefined1 auStack_ae8 [32];
  timeval tStack_ac8;
  undefined1 auStack_ab8 [272];
  size_t sStack_9a8;
  char *pcStack_9a0;
  uint8_t uStack_998;
  undefined2 uStack_990;
  undefined1 uStack_970;
  fdb_kvs_handle *pfStack_8b8;
  char acStack_8b0 [256];
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paStack_7b0;
  fdb_kvs_handle *pfStack_7a8;
  fdb_kvs_handle *pfStack_7a0;
  fdb_kvs_handle *pfStack_798;
  fdb_kvs_handle *pfStack_790;
  fdb_kvs_handle *pfStack_788;
  fdb_kvs_handle *pfStack_778;
  fdb_file_handle *pfStack_770;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_768;
  fdb_doc *pfStack_760;
  fdb_kvs_handle *pfStack_758;
  fdb_kvs_handle *pfStack_750;
  fdb_kvs_handle *pfStack_748;
  fdb_kvs_handle *pfStack_740;
  fdb_kvs_handle *pfStack_738;
  fdb_kvs_handle *pfStack_730;
  fdb_kvs_config fStack_728;
  fdb_kvs_config fStack_710;
  fdb_kvs_config fStack_6f0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aaStack_6d0 [4];
  timeval tStack_6b0;
  fdb_config fStack_6a0;
  fdb_kvs_info *pfStack_588;
  atomic<unsigned_long> aStack_580;
  fdb_kvs_handle *pfStack_578;
  atomic<unsigned_long> aStack_570;
  fdb_kvs_handle *pfStack_568;
  atomic<unsigned_long> aStack_560;
  fdb_kvs_handle *local_550;
  fdb_kvs_handle *local_548;
  fdb_file_handle *local_540;
  undefined1 local_538 [16];
  fdb_config *local_528;
  fdb_kvs_info local_520;
  fdb_kvs_config local_4f0;
  undefined1 auStack_4d8 [176];
  char local_428 [256];
  undefined1 local_328 [520];
  undefined8 local_120;
  undefined8 local_118;
  undefined4 local_104;
  undefined1 local_f9;
  
  aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111bf1;
  gettimeofday((timeval *)(auStack_4d8 + 0xa0),(__timezone_ptr_t)0x0);
  aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111bf6;
  memleak_start();
  pcVar15 = "rm -rf  mvcc_test* > errorlog.txt";
  aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c05;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar20 = (fdb_config *)(local_328 + 0x200);
  aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c15;
  fdb_get_default_config();
  aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c1f;
  fdb_get_default_kvs_config();
  local_120 = 0;
  local_118 = 0x400;
  local_104 = 1;
  local_f9 = 0;
  aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c44;
  system("rm -rf  mvcc_test* > errorlog.txt");
  aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c58;
  fVar4 = fdb_open(&local_540,"./mvcc_test1",pfVar20);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c74;
    fVar4 = fdb_kvs_open_default(local_540,&local_550,&local_4f0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00112359;
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c8d;
    fVar4 = fdb_snapshot_open(local_550,&local_548,0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011235e;
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111ca4;
    fdb_get_kvs_info(local_548,&local_520);
    if ((fdb_config *)local_520.last_seqnum != (fdb_config *)0x0) {
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111cb4;
      in_memory_snapshot_test();
    }
    pcVar15 = local_538;
    in_RCX = (fdb_kvs_handle *)0x0;
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111cd7;
    fdb_iterator_init(local_548,(fdb_iterator **)pcVar15,(void *)0x0,0,(void *)0x0,0,0);
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111ce4;
    fVar4 = fdb_iterator_get((fdb_iterator *)local_538._0_8_,(fdb_doc **)(local_538 + 8));
    _Var10._M_i = (__int_type)pfVar20;
    if (fVar4 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00112363;
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111cf7;
    fdb_iterator_close((fdb_iterator *)local_538._0_8_);
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d01;
    fdb_kvs_close(local_548);
    lVar18 = 0;
    uVar19 = 0;
    do {
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d23;
      sprintf(local_428,"key%d",uVar19 & 0xffffffff);
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d3f;
      sprintf(local_328,"meta%d",uVar19 & 0xffffffff);
      pcVar15 = local_328 + 0x100;
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d5b;
      sprintf(pcVar15,"body%d",uVar19 & 0xffffffff);
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d6e;
      sVar7 = strlen(local_428);
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d79;
      sVar8 = strlen(local_328);
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d84;
      sVar9 = strlen(pcVar15);
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111da9;
      fdb_doc_create((fdb_doc **)(auStack_4d8 + lVar18),local_428,sVar7,local_328,sVar8,pcVar15,
                     sVar9);
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111dbb;
      fdb_set(local_550,*(fdb_doc **)(auStack_4d8 + uVar19 * 8));
      uVar19 = uVar19 + 1;
      lVar18 = lVar18 + 8;
    } while (uVar19 != 5);
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111ddb;
    fdb_commit(local_540,'\x01');
    uVar19 = 5;
    ppfVar21 = (fdb_doc **)(auStack_4d8 + 0x28);
    do {
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e05;
      sprintf(local_428,"key%d",uVar19 & 0xffffffff);
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e21;
      sprintf(local_328,"meta%d",uVar19 & 0xffffffff);
      pcVar15 = local_328 + 0x100;
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e3d;
      sprintf(pcVar15,"body%d",uVar19 & 0xffffffff);
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e45;
      sVar7 = strlen(local_428);
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e50;
      sVar8 = strlen(local_328);
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e5b;
      sVar9 = strlen(pcVar15);
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e7b;
      fdb_doc_create(ppfVar21,local_428,sVar7,local_328,sVar8,pcVar15,sVar9);
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e88;
      fdb_set(local_550,*ppfVar21);
      uVar19 = uVar19 + 1;
      ppfVar21 = ppfVar21 + 1;
    } while (uVar19 != 9);
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111eb7;
    sprintf(local_428,"key%d",9);
    unaff_R15 = (fdb_kvs_handle *)local_328;
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111ed5;
    sprintf((char *)unaff_R15,"meta%d",9);
    unaff_R12 = local_328 + 0x100;
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111ef3;
    sprintf(unaff_R12,"Body%d",9);
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f03;
    unaff_R13 = (char *)strlen(local_428);
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f0e;
    unaff_RBP._M_i = strlen((char *)unaff_R15);
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f19;
    sVar7 = strlen(unaff_R12);
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f34;
    in_RCX = unaff_R15;
    fdb_doc_create((fdb_doc **)(auStack_4d8 + 0x48),local_428,(size_t)unaff_R13,unaff_R15,
                   unaff_RBP._M_i,unaff_R12,sVar7);
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f41;
    fdb_set(local_550,(fdb_doc *)auStack_4d8._72_8_);
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f4d;
    fdb_commit(local_540,'\0');
    **(undefined1 **)(auStack_4d8._72_8_ + 0x40) = 0x62;
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f64;
    fdb_set(local_550,(fdb_doc *)auStack_4d8._72_8_);
    _Var10._M_i = *(fdb_seqnum_t *)(auStack_4d8._72_8_ + 0x28);
    pcVar15 = (char *)&local_520;
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f7d;
    fdb_get_kvs_info(local_550,(fdb_kvs_info *)pcVar15);
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f90;
    fVar4 = fdb_snapshot_open(local_550,&local_548,local_520.last_seqnum);
    if (fVar4 != FDB_RESULT_NO_DB_INSTANCE) goto LAB_00112368;
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111fb4;
    local_528 = (fdb_config *)_Var10._M_i;
    fVar4 = fdb_snapshot_open(local_550,&local_548,0xffffffffffffffff);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011236d;
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111fc8;
    fdb_commit(local_540,'\0');
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111fda;
    fdb_set(local_550,(fdb_doc *)auStack_4d8._72_8_);
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111fe6;
    fdb_commit(local_540,'\0');
    uVar19 = 10;
    pcVar15 = (char *)0x50;
    do {
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11200d;
      sprintf(local_428,"key%d",uVar19 & 0xffffffff);
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112029;
      sprintf(local_328,"meta%d",uVar19 & 0xffffffff);
      unaff_R12 = local_328 + 0x100;
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112045;
      sprintf(unaff_R12,"body%d",uVar19 & 0xffffffff);
      unaff_RBP._M_i = (__int_type)(auStack_4d8 + (long)pcVar15);
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112058;
      _Var10._M_i = strlen(local_428);
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112063;
      unaff_R13 = (char *)strlen(local_328);
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11206e;
      sVar7 = strlen(unaff_R12);
      in_RCX = (fdb_kvs_handle *)local_328;
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112093;
      fdb_doc_create((fdb_doc **)unaff_RBP._M_i,local_428,_Var10._M_i,in_RCX,(size_t)unaff_R13,
                     unaff_R12,sVar7);
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1120a5;
      fdb_set(local_550,*(fdb_doc **)(auStack_4d8 + uVar19 * 8));
      uVar19 = uVar19 + 1;
      pcVar15 = (char *)((long)pcVar15 + 8);
    } while (uVar19 != 0xf);
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1120ce;
    fVar4 = fdb_set_log_callback(local_550,logCallbackFunc,"in_memory_snapshot_test");
    unaff_R15 = (fdb_kvs_handle *)0xf;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00112372;
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1120e8;
    fdb_get_kvs_info(local_548,&local_520);
    if ((fdb_config *)local_520.last_seqnum != local_528) {
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1120fd;
      in_memory_snapshot_test();
    }
    uVar19 = 0xf;
    pfVar20 = (fdb_config *)(auStack_4d8 + 0x78);
    do {
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112125;
      sprintf(local_428,"key%d",uVar19 & 0xffffffff);
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112140;
      sprintf(local_328,"meta%d",uVar19 & 0xffffffff);
      unaff_RBP._M_i = (__int_type)(local_328 + 0x100);
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11215b;
      sprintf((char *)unaff_RBP._M_i,"body%d",uVar19 & 0xffffffff);
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112163;
      unaff_R15 = (fdb_kvs_handle *)strlen(local_428);
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11216e;
      unaff_R12 = (char *)strlen(local_328);
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112179;
      sVar7 = strlen((char *)unaff_RBP._M_i);
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112199;
      fdb_doc_create((fdb_doc **)pfVar20,local_428,(size_t)unaff_R15,local_328,(size_t)unaff_R12,
                     (void *)unaff_RBP._M_i,sVar7);
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1121a6;
      fdb_set(local_550,*(fdb_doc **)pfVar20);
      uVar19 = uVar19 + 1;
      pfVar20 = (fdb_config *)((long)pfVar20 + 8);
    } while (uVar19 != 0x14);
    unaff_R13 = (char *)0x0;
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1121c6;
    fdb_commit(local_540,'\0');
    in_RCX = (fdb_kvs_handle *)0x0;
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1121e6;
    fdb_iterator_init(local_548,(fdb_iterator **)local_538,(void *)0x0,0,(void *)0x0,0,0);
    pcVar15 = local_538 + 8;
    local_538._8_8_ = (fdb_config *)0x0;
    do {
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1121ff;
      fVar4 = fdb_iterator_get((fdb_iterator *)local_538._0_8_,(fdb_doc **)pcVar15);
      _Var10._M_i = local_538._8_8_;
      if (fVar4 != FDB_RESULT_SUCCESS) {
LAB_00112339:
        aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11233e;
        in_memory_snapshot_test();
LAB_0011233e:
        aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112349;
        in_memory_snapshot_test();
LAB_00112349:
        aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112354;
        in_memory_snapshot_test();
        goto LAB_00112354;
      }
      unaff_R15 = *(fdb_kvs_handle **)(local_538._8_8_ + 0x20);
      unaff_RBP._M_i = *(__int_type *)(auStack_4d8 + (long)unaff_R13 * 8);
      unaff_R12 = (char *)((fdb_kvs_handle *)unaff_RBP._M_i)->op_stats;
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11222a;
      iVar5 = bcmp(unaff_R15,unaff_R12,*(size_t *)local_538._8_8_);
      pfVar20 = (fdb_config *)_Var10._M_i;
      if (iVar5 != 0) {
        aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112339;
        in_memory_snapshot_test();
        goto LAB_00112339;
      }
      unaff_R15 = *(fdb_kvs_handle **)(_Var10._M_i + 0x38);
      unaff_R12 = (char *)((fdb_kvs_handle *)unaff_RBP._M_i)->staletree;
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112249;
      iVar5 = bcmp(unaff_R15,unaff_R12,*(uint64_t *)(_Var10._M_i + 8));
      if (iVar5 != 0) goto LAB_00112349;
      unaff_R15 = *(fdb_kvs_handle **)(_Var10._M_i + 0x40);
      unaff_R12 = (char *)(((fdb_kvs_handle *)unaff_RBP._M_i)->field_6).seqtree;
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112268;
      iVar5 = bcmp(unaff_R15,unaff_R12,*(uint64_t *)(_Var10._M_i + 0x10));
      if (iVar5 != 0) goto LAB_0011233e;
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112278;
      fdb_doc_free((fdb_doc *)_Var10._M_i);
      local_538._8_8_ = (fdb_config *)0x0;
      unaff_R13 = &(((fdb_kvs_handle *)unaff_R13)->kvs_config).field_0x1;
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11228e;
      fVar4 = fdb_iterator_next((fdb_iterator *)local_538._0_8_);
    } while (fVar4 != FDB_RESULT_ITERATOR_FAIL);
    if ((int)unaff_R13 == 10) {
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1122ab;
      fdb_iterator_close((fdb_iterator *)local_538._0_8_);
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1122b5;
      fdb_kvs_close(local_550);
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1122bf;
      fdb_kvs_close(local_548);
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1122c9;
      fdb_close(local_540);
      lVar18 = 0;
      do {
        aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1122d8;
        fdb_doc_free(*(fdb_doc **)(auStack_4d8 + lVar18 * 8));
        lVar18 = lVar18 + 1;
      } while (lVar18 != 0x14);
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1122e6;
      fdb_shutdown();
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1122eb;
      memleak_end();
      pcVar15 = "%s PASSED\n";
      if (in_memory_snapshot_test()::__test_pass != '\0') {
        pcVar15 = "%s FAILED\n";
      }
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11231c;
      fprintf(_stderr,pcVar15,"in-memory snapshot test");
      return;
    }
  }
  else {
LAB_00112354:
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112359;
    in_memory_snapshot_test();
LAB_00112359:
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11235e;
    in_memory_snapshot_test();
LAB_0011235e:
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112363;
    in_memory_snapshot_test();
    _Var10._M_i = (__int_type)pfVar20;
LAB_00112363:
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112368;
    in_memory_snapshot_test();
LAB_00112368:
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11236d;
    in_memory_snapshot_test();
LAB_0011236d:
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112372;
    in_memory_snapshot_test();
LAB_00112372:
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112377;
    in_memory_snapshot_test();
  }
  aStack_560.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)in_memory_snapshot_cleanup_test;
  in_memory_snapshot_test();
  handle = (char *)0x0;
  pfStack_788 = (fdb_kvs_handle *)0x11239f;
  pfStack_588 = (fdb_kvs_info *)pcVar15;
  aStack_580.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)unaff_R12;
  pfStack_578 = (fdb_kvs_handle *)unaff_R13;
  aStack_570.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var10._M_i;
  pfStack_568 = unaff_R15;
  aStack_560.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)unaff_RBP._M_i;
  gettimeofday(&tStack_6b0,(__timezone_ptr_t)0x0);
  pfStack_788 = (fdb_kvs_handle *)0x1123a4;
  memleak_start();
  aStack_768.seqtree = (btree *)0x0;
  pcVar15 = "rm -rf  mvcc_test* > errorlog.txt";
  pfStack_788 = (fdb_kvs_handle *)0x1123b8;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar11 = (fdb_kvs_handle *)&fStack_6a0.seqtree_opt;
  pfStack_788 = (fdb_kvs_handle *)0x1123c8;
  fdb_get_default_config();
  pfStack_788 = (fdb_kvs_handle *)0x1123d2;
  fdb_get_default_kvs_config();
  fStack_6a0.compaction_minimum_filesize = 0x400;
  fStack_6a0._68_4_ = 1;
  fStack_6a0.prefetch_duration._7_1_ = '\0';
  fStack_6a0.breakpad_minidump_dir = (char *)0x0;
  pfStack_788 = (fdb_kvs_handle *)0x1123f6;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfStack_788 = (fdb_kvs_handle *)0x11240a;
  fVar4 = fdb_open(&pfStack_770,"./mvcc_test1",(fdb_config *)pfVar11);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pfStack_788 = (fdb_kvs_handle *)0x112426;
    fVar4 = fdb_kvs_open_default(pfStack_770,&pfStack_778,&fStack_728);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001127ba;
    pfStack_788 = (fdb_kvs_handle *)0x112446;
    fVar4 = fdb_set_log_callback(pfStack_778,logCallbackFunc,"in_memory_snapshot_cleanup_test");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001127bf;
    pcVar15 = (char *)aaStack_6d0;
    aaStack_6d0[0]._0_4_ = 0x79656b;
    pfVar11 = (fdb_kvs_handle *)&fStack_6f0;
    fStack_6f0._4_1_ = 0;
    fStack_6f0.create_if_missing = true;
    fStack_6f0._1_3_ = 0x617465;
    handle = &fStack_710.create_if_missing;
    fStack_710._4_1_ = 0;
    fStack_710.create_if_missing = true;
    fStack_710._1_3_ = 0x79646f;
    pfStack_788 = (fdb_kvs_handle *)0x112489;
    unaff_R12 = (char *)strlen(pcVar15);
    pfStack_788 = (fdb_kvs_handle *)0x112494;
    unaff_R13 = (char *)strlen((char *)pfVar11);
    pfStack_788 = (fdb_kvs_handle *)0x11249f;
    sVar7 = strlen(handle);
    unaff_RBP._M_i = (__int_type)&aStack_768;
    pfStack_788 = (fdb_kvs_handle *)0x1124bf;
    in_RCX = pfVar11;
    fdb_doc_create((fdb_doc **)unaff_RBP._M_i,pcVar15,(size_t)unaff_R12,pfVar11,(size_t)unaff_R13,
                   handle,sVar7);
    pfStack_788 = (fdb_kvs_handle *)0x1124cd;
    fdb_set(pfStack_778,(fdb_doc *)aStack_768.seqtree);
    pfStack_788 = (fdb_kvs_handle *)0x1124d9;
    fdb_commit(pfStack_770,'\0');
    pfStack_788 = (fdb_kvs_handle *)0x1124ef;
    fVar4 = fdb_snapshot_open(pfStack_778,&pfStack_748,0xffffffffffffffff);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001127c4;
    pfStack_788 = (fdb_kvs_handle *)0x112506;
    fVar4 = fdb_set(pfStack_778,(fdb_doc *)aStack_768.seqtree);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001127c9;
    pfStack_788 = (fdb_kvs_handle *)0x11251a;
    fVar4 = fdb_commit(pfStack_770,'\0');
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001127ce;
    pfStack_788 = (fdb_kvs_handle *)0x112538;
    fVar4 = fdb_snapshot_open(pfStack_778,&pfStack_750,0xffffffffffffffff);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001127d3;
    pfStack_788 = (fdb_kvs_handle *)0x11254f;
    fVar4 = fdb_set(pfStack_778,(fdb_doc *)aStack_768.seqtree);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001127d8;
    pfStack_788 = (fdb_kvs_handle *)0x112563;
    fVar4 = fdb_commit(pfStack_770,'\0');
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001127dd;
    pfStack_788 = (fdb_kvs_handle *)0x11257a;
    fVar4 = fdb_set(pfStack_778,(fdb_doc *)aStack_768.seqtree);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001127e2;
    pfStack_788 = (fdb_kvs_handle *)0x11258e;
    fVar4 = fdb_commit(pfStack_770,'\0');
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001127e7;
    pcVar15 = (char *)&aStack_768;
    pfStack_788 = (fdb_kvs_handle *)0x1125a3;
    fdb_doc_free((fdb_doc *)aStack_768.seqtree);
    pfVar11 = (fdb_kvs_handle *)&fStack_6a0;
    fStack_6a0.chunksize = 0x654b;
    fStack_6a0._2_2_ = 0x79;
    pfStack_788 = (fdb_kvs_handle *)0x1125ba;
    handle = (char *)strlen((char *)pfVar11);
    unaff_R12 = &fStack_6f0.create_if_missing;
    pfStack_788 = (fdb_kvs_handle *)0x1125cd;
    unaff_R13 = (char *)strlen(unaff_R12);
    unaff_RBP._M_i = (__int_type)&fStack_710;
    pfStack_788 = (fdb_kvs_handle *)0x1125dd;
    sVar7 = strlen((char *)unaff_RBP._M_i);
    pfStack_788 = (fdb_kvs_handle *)0x1125f8;
    in_RCX = (fdb_kvs_handle *)unaff_R12;
    fdb_doc_create((fdb_doc **)pcVar15,pfVar11,(size_t)handle,unaff_R12,(size_t)unaff_R13,
                   (void *)unaff_RBP._M_i,sVar7);
    pfStack_788 = (fdb_kvs_handle *)0x112605;
    fdb_set(pfStack_778,(fdb_doc *)aStack_768.seqtree);
    pfStack_788 = (fdb_kvs_handle *)0x11261b;
    fVar4 = fdb_snapshot_open(pfStack_778,&pfStack_758,0xffffffffffffffff);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001127ec;
    pcVar15 = (char *)aaStack_6d0;
    pfStack_788 = (fdb_kvs_handle *)0x112633;
    sVar7 = strlen(pcVar15);
    pfVar11 = (fdb_kvs_handle *)&pfStack_760;
    in_RCX = (fdb_kvs_handle *)0x0;
    pfStack_788 = (fdb_kvs_handle *)0x112656;
    fdb_doc_create((fdb_doc **)pfVar11,pcVar15,sVar7,(void *)0x0,0,(void *)0x0,0);
    pfStack_788 = (fdb_kvs_handle *)0x112663;
    fVar4 = fdb_get(pfStack_748,pfStack_760);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001127f1;
    pfStack_788 = (fdb_kvs_handle *)0x11267a;
    fVar4 = fdb_get(pfStack_750,pfStack_760);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001127f6;
    pfStack_788 = (fdb_kvs_handle *)0x112691;
    fVar4 = fdb_get(pfStack_758,pfStack_760);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001127fb;
    pfStack_788 = (fdb_kvs_handle *)0x1126a3;
    fdb_doc_free(pfStack_760);
    pfStack_788 = (fdb_kvs_handle *)0x1126b7;
    fVar4 = fdb_snapshot_open(pfStack_778,&pfStack_730,1);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00112800;
    pfStack_788 = (fdb_kvs_handle *)0x1126d3;
    fVar4 = fdb_snapshot_open(pfStack_778,&pfStack_738,2);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00112805;
    pfStack_788 = (fdb_kvs_handle *)0x1126ef;
    fVar4 = fdb_snapshot_open(pfStack_778,&pfStack_740,3);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011280a;
    pfStack_788 = (fdb_kvs_handle *)0x112701;
    fdb_kvs_close(pfStack_748);
    pfStack_788 = (fdb_kvs_handle *)0x11270b;
    fdb_kvs_close(pfStack_750);
    pfStack_788 = (fdb_kvs_handle *)0x112715;
    fdb_kvs_close(pfStack_758);
    pfStack_788 = (fdb_kvs_handle *)0x112724;
    fVar4 = fdb_commit(pfStack_770,'\x01');
    if (fVar4 == FDB_RESULT_SUCCESS) {
      pfStack_788 = (fdb_kvs_handle *)0x112736;
      fdb_kvs_close(pfStack_730);
      pfStack_788 = (fdb_kvs_handle *)0x112740;
      fdb_kvs_close(pfStack_738);
      pfStack_788 = (fdb_kvs_handle *)0x11274a;
      fdb_kvs_close(pfStack_740);
      pfStack_788 = (fdb_kvs_handle *)0x112754;
      fdb_kvs_close(pfStack_778);
      pfStack_788 = (fdb_kvs_handle *)0x11275e;
      fdb_close(pfStack_770);
      pfStack_788 = (fdb_kvs_handle *)0x112768;
      fdb_doc_free((fdb_doc *)aStack_768.seqtree);
      pfStack_788 = (fdb_kvs_handle *)0x11276d;
      fdb_shutdown();
      pfStack_788 = (fdb_kvs_handle *)0x112772;
      memleak_end();
      pcVar15 = "%s PASSED\n";
      if (in_memory_snapshot_cleanup_test()::__test_pass != '\0') {
        pcVar15 = "%s FAILED\n";
      }
      pfStack_788 = (fdb_kvs_handle *)0x1127a3;
      fprintf(_stderr,pcVar15,"in-memory snapshot cleanup test");
      return;
    }
  }
  else {
    pfStack_788 = (fdb_kvs_handle *)0x1127ba;
    in_memory_snapshot_cleanup_test();
LAB_001127ba:
    pfStack_788 = (fdb_kvs_handle *)0x1127bf;
    in_memory_snapshot_cleanup_test();
LAB_001127bf:
    pfStack_788 = (fdb_kvs_handle *)0x1127c4;
    in_memory_snapshot_cleanup_test();
LAB_001127c4:
    pfStack_788 = (fdb_kvs_handle *)0x1127c9;
    in_memory_snapshot_cleanup_test();
LAB_001127c9:
    pfStack_788 = (fdb_kvs_handle *)0x1127ce;
    in_memory_snapshot_cleanup_test();
LAB_001127ce:
    pfStack_788 = (fdb_kvs_handle *)0x1127d3;
    in_memory_snapshot_cleanup_test();
LAB_001127d3:
    pfStack_788 = (fdb_kvs_handle *)0x1127d8;
    in_memory_snapshot_cleanup_test();
LAB_001127d8:
    pfStack_788 = (fdb_kvs_handle *)0x1127dd;
    in_memory_snapshot_cleanup_test();
LAB_001127dd:
    pfStack_788 = (fdb_kvs_handle *)0x1127e2;
    in_memory_snapshot_cleanup_test();
LAB_001127e2:
    pfStack_788 = (fdb_kvs_handle *)0x1127e7;
    in_memory_snapshot_cleanup_test();
LAB_001127e7:
    pfStack_788 = (fdb_kvs_handle *)0x1127ec;
    in_memory_snapshot_cleanup_test();
LAB_001127ec:
    pfStack_788 = (fdb_kvs_handle *)0x1127f1;
    in_memory_snapshot_cleanup_test();
LAB_001127f1:
    pfStack_788 = (fdb_kvs_handle *)0x1127f6;
    in_memory_snapshot_cleanup_test();
LAB_001127f6:
    pfStack_788 = (fdb_kvs_handle *)0x1127fb;
    in_memory_snapshot_cleanup_test();
LAB_001127fb:
    pfStack_788 = (fdb_kvs_handle *)0x112800;
    in_memory_snapshot_cleanup_test();
LAB_00112800:
    pfStack_788 = (fdb_kvs_handle *)0x112805;
    in_memory_snapshot_cleanup_test();
LAB_00112805:
    pfStack_788 = (fdb_kvs_handle *)0x11280a;
    in_memory_snapshot_cleanup_test();
LAB_0011280a:
    pfStack_788 = (fdb_kvs_handle *)0x11280f;
    in_memory_snapshot_cleanup_test();
  }
  pfStack_788 = (fdb_kvs_handle *)in_memory_snapshot_on_dirty_hbtrie_test;
  in_memory_snapshot_cleanup_test();
  pfStack_b50 = (fdb_kvs_handle *)0x112834;
  paStack_7b0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)pcVar15;
  pfStack_7a8 = (fdb_kvs_handle *)unaff_R12;
  pfStack_7a0 = (fdb_kvs_handle *)unaff_R13;
  pfStack_798 = pfVar11;
  pfStack_790 = (fdb_kvs_handle *)handle;
  pfStack_788 = (fdb_kvs_handle *)unaff_RBP._M_i;
  gettimeofday(&tStack_ac8,(__timezone_ptr_t)0x0);
  pfStack_8b8 = (fdb_kvs_handle *)0x202066722d206d72;
  builtin_strncpy(acStack_8b0,"mvcc_test* > errorlog.txt",0x1a);
  pfStack_b50 = (fdb_kvs_handle *)0x11285c;
  system((char *)&pfStack_8b8);
  pfStack_b50 = (fdb_kvs_handle *)0x112861;
  memleak_start();
  pfStack_b50 = (fdb_kvs_handle *)0x11286b;
  pfVar11 = (fdb_kvs_handle *)malloc(0x20);
  pcVar15 = auStack_ab8 + 0x108;
  pfStack_b50 = (fdb_kvs_handle *)0x11287e;
  fdb_get_default_config();
  uStack_990._0_1_ = true;
  uStack_990._1_1_ = true;
  uStack_998 = '\x01';
  pcStack_9a0 = (char *)0x3c;
  uStack_970 = 1;
  sStack_9a8 = 0;
  pfStack_b50 = (fdb_kvs_handle *)0x1128a9;
  fdb_get_default_kvs_config();
  pfStack_b50 = (fdb_kvs_handle *)0x1128bd;
  fVar4 = fdb_open(&pfStack_b00,"./mvcc_test",(fdb_config *)pcVar15);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001130d2;
  in_RCX = (fdb_kvs_handle *)(auStack_ae8 + 8);
  pfStack_b50 = (fdb_kvs_handle *)0x1128e0;
  fVar4 = fdb_kvs_open(pfStack_b00,&pfStack_b18,"db",(fdb_kvs_config *)in_RCX);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001130d7;
  puStack_b20 = (undefined4 *)((long)&pfVar11->kvs + 2);
  pcVar15 = "k%05d";
  handle = auStack_ab8;
  unaff_R12 = "value%08d";
  unaff_RBP._M_i = 0;
  do {
    pfStack_b50 = (fdb_kvs_handle *)0x11291b;
    sprintf(handle,"k%05d",unaff_RBP._M_i);
    *(undefined4 *)&pfVar11->kvs_config = 0x78787878;
    *(undefined4 *)&(pfVar11->kvs_config).field_0x4 = 0x78787878;
    *(undefined4 *)&(pfVar11->kvs_config).custom_cmp = 0x78787878;
    *(undefined4 *)((long)&(pfVar11->kvs_config).custom_cmp + 4) = 0x78787878;
    *(undefined4 *)((long)&(pfVar11->kvs_config).custom_cmp + 2) = 0x78787878;
    *(undefined4 *)((long)&(pfVar11->kvs_config).custom_cmp + 6) = 0x78787878;
    *(undefined4 *)((long)&(pfVar11->kvs_config).custom_cmp_param + 2) = 0x78787878;
    *(undefined4 *)((long)&(pfVar11->kvs_config).custom_cmp_param + 6) = 0x78787878;
    *(undefined2 *)(puStack_b20 + 1) = 0x3e;
    *puStack_b20 = 0x646e653c;
    pfStack_b50 = (fdb_kvs_handle *)0x112949;
    sprintf((char *)pfVar11,"value%08d",unaff_RBP._M_i);
    unaff_R13 = (char *)pfStack_b18;
    pfStack_b50 = (fdb_kvs_handle *)0x112956;
    sVar7 = strlen(handle);
    pfStack_b50 = (fdb_kvs_handle *)0x11296e;
    in_RCX = pfVar11;
    fVar4 = fdb_set_kv((fdb_kvs_handle *)unaff_R13,handle,sVar7 + 1,pfVar11,0x20);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113057;
    uVar16 = (int)unaff_RBP._M_i + 1;
    unaff_RBP._M_i = (__int_type)uVar16;
  } while (uVar16 != 0x1e);
  pfStack_b50 = (fdb_kvs_handle *)0x11298c;
  fVar4 = fdb_commit(pfStack_b00,'\x01');
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001130dc;
  pfStack_b50 = (fdb_kvs_handle *)0x1129aa;
  fVar4 = fdb_snapshot_open(pfStack_b18,&pfStack_b28,0xffffffffffffffff);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001130e1;
  pfStack_b50 = (fdb_kvs_handle *)0x1129c8;
  fVar4 = fdb_snapshot_open(pfStack_b28,&pfStack_b10,0xffffffffffffffff);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001130e6;
  unaff_RBP._M_i = 0x1e;
  handle = auStack_ab8;
  unaff_R12 = "value%08d";
  do {
    pfStack_b50 = (fdb_kvs_handle *)0x1129fa;
    sprintf(handle,"k%05d",unaff_RBP._M_i);
    *(undefined4 *)&pfVar11->kvs_config = 0x78787878;
    *(undefined4 *)&(pfVar11->kvs_config).field_0x4 = 0x78787878;
    *(undefined4 *)&(pfVar11->kvs_config).custom_cmp = 0x78787878;
    *(undefined4 *)((long)&(pfVar11->kvs_config).custom_cmp + 4) = 0x78787878;
    *(undefined4 *)((long)&(pfVar11->kvs_config).custom_cmp + 2) = 0x78787878;
    *(undefined4 *)((long)&(pfVar11->kvs_config).custom_cmp + 6) = 0x78787878;
    *(undefined4 *)((long)&(pfVar11->kvs_config).custom_cmp_param + 2) = 0x78787878;
    *(undefined4 *)((long)&(pfVar11->kvs_config).custom_cmp_param + 6) = 0x78787878;
    *(undefined2 *)(puStack_b20 + 1) = 0x3e;
    *puStack_b20 = 0x646e653c;
    pfStack_b50 = (fdb_kvs_handle *)0x112a28;
    sprintf((char *)pfVar11,"value%08d",unaff_RBP._M_i);
    unaff_R13 = (char *)pfStack_b18;
    pfStack_b50 = (fdb_kvs_handle *)0x112a35;
    sVar7 = strlen(handle);
    pfStack_b50 = (fdb_kvs_handle *)0x112a4d;
    in_RCX = pfVar11;
    fVar4 = fdb_set_kv((fdb_kvs_handle *)unaff_R13,handle,sVar7 + 1,pfVar11,0x20);
    pfVar12 = (fdb_kvs_handle *)"k%05d";
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011305c;
    uVar16 = (int)unaff_RBP._M_i + 1;
    unaff_RBP._M_i = (__int_type)uVar16;
  } while (uVar16 != 300);
  pfStack_b50 = (fdb_kvs_handle *)0x112a7d;
  sprintf((char *)auStack_ab8,"k%05d",0x1e);
  handle = (char *)pfStack_b28;
  pfStack_b50 = (fdb_kvs_handle *)0x112a8a;
  sVar7 = strlen((char *)auStack_ab8);
  in_RCX = (fdb_kvs_handle *)auStack_ae8;
  pfStack_b50 = (fdb_kvs_handle *)0x112aa3;
  fVar4 = fdb_get_kv((fdb_kvs_handle *)handle,(fdb_kvs_handle *)auStack_ab8,sVar7 + 1,
                     (void **)in_RCX,&sStack_af0);
  pfVar12 = pfStack_b10;
  pcVar15 = (char *)auStack_ab8;
  if (fVar4 == FDB_RESULT_SUCCESS) goto LAB_001130eb;
  handle = auStack_ab8;
  pfStack_b50 = (fdb_kvs_handle *)0x112ac0;
  sVar7 = strlen(handle);
  in_RCX = (fdb_kvs_handle *)auStack_ae8;
  pfStack_b50 = (fdb_kvs_handle *)0x112ad9;
  fVar4 = fdb_get_kv(pfVar12,handle,sVar7 + 1,(void **)in_RCX,&sStack_af0);
  if (fVar4 == FDB_RESULT_SUCCESS) goto LAB_001130f0;
  pfStack_b50 = (fdb_kvs_handle *)0x112aeb;
  fVar4 = fdb_kvs_close(pfStack_b28);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001130f5;
  pfStack_b50 = (fdb_kvs_handle *)0x112afd;
  fVar4 = fdb_kvs_close(pfStack_b10);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001130fa;
  pfStack_b50 = (fdb_kvs_handle *)0x112b1b;
  fVar4 = fdb_snapshot_open(pfStack_b18,&pfStack_b28,0xffffffffffffffff);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001130ff;
  in_RCX = (fdb_kvs_handle *)0x0;
  pfStack_b50 = (fdb_kvs_handle *)0x112b43;
  fVar4 = fdb_iterator_init(pfStack_b28,&pfStack_b30,(void *)0x0,0,(void *)0x0,0,0);
  pcVar15 = (char *)pfVar12;
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113104;
  unaff_R12 = auStack_ab8;
  unaff_R13 = "value%08d";
  unaff_RBP._M_i = 0;
  do {
    pfStack_b40 = (fdb_kvs_handle *)0x0;
    pfStack_b50 = (fdb_kvs_handle *)0x112b74;
    fVar4 = fdb_iterator_get(pfStack_b30,(fdb_doc **)&pfStack_b40);
    pcVar15 = (char *)pfVar12;
    if (fVar4 != FDB_RESULT_SUCCESS) break;
    pfStack_b50 = (fdb_kvs_handle *)0x112b8f;
    sprintf(unaff_R12,"k%05d",unaff_RBP._M_i);
    *(undefined4 *)&pfVar11->kvs_config = 0x78787878;
    *(undefined4 *)&(pfVar11->kvs_config).field_0x4 = 0x78787878;
    *(undefined4 *)&(pfVar11->kvs_config).custom_cmp = 0x78787878;
    *(undefined4 *)((long)&(pfVar11->kvs_config).custom_cmp + 4) = 0x78787878;
    *(undefined4 *)((long)&(pfVar11->kvs_config).custom_cmp + 2) = 0x78787878;
    *(undefined4 *)((long)&(pfVar11->kvs_config).custom_cmp + 6) = 0x78787878;
    *(undefined4 *)((long)&(pfVar11->kvs_config).custom_cmp_param + 2) = 0x78787878;
    *(undefined4 *)((long)&(pfVar11->kvs_config).custom_cmp_param + 6) = 0x78787878;
    *(undefined2 *)(puStack_b20 + 1) = 0x3e;
    *puStack_b20 = 0x646e653c;
    pfStack_b50 = (fdb_kvs_handle *)0x112bbd;
    sprintf((char *)pfVar11,"value%08d",unaff_RBP._M_i);
    pfVar12 = pfStack_b40;
    handle = (char *)pfStack_b40->op_stats;
    pfStack_b50 = (fdb_kvs_handle *)0x112bd4;
    iVar5 = bcmp(handle,unaff_R12,*(size_t *)&pfStack_b40->kvs_config);
    if (iVar5 != 0) goto LAB_00113061;
    handle = (char *)(pfVar12->field_6).seqtree;
    pfStack_b50 = (fdb_kvs_handle *)0x112bef;
    iVar5 = bcmp(handle,pfVar11,(size_t)(pfVar12->kvs_config).custom_cmp_param);
    if (iVar5 != 0) goto LAB_00113071;
    unaff_RBP._M_i = (__int_type)((int)unaff_RBP._M_i + 1);
    pfStack_b50 = (fdb_kvs_handle *)0x112c01;
    fdb_doc_free((fdb_doc *)pfVar12);
    pfStack_b50 = (fdb_kvs_handle *)0x112c0b;
    fVar4 = fdb_iterator_next(pfStack_b30);
    pcVar15 = (char *)pfVar12;
  } while (fVar4 == FDB_RESULT_SUCCESS);
  if ((int)unaff_RBP._M_i != 300) goto LAB_00113109;
  pfStack_b50 = (fdb_kvs_handle *)0x112c29;
  fVar4 = fdb_iterator_close(pfStack_b30);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011310e;
  pfStack_b50 = (fdb_kvs_handle *)0x112c47;
  fVar4 = fdb_snapshot_open(pfStack_b28,&pfStack_b10,0xffffffffffffffff);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113113;
  in_RCX = (fdb_kvs_handle *)0x0;
  pfStack_b50 = (fdb_kvs_handle *)0x112c6f;
  fVar4 = fdb_iterator_init(pfStack_b28,&pfStack_b30,(void *)0x0,0,(void *)0x0,0,0);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113118;
  in_RCX = (fdb_kvs_handle *)0x0;
  pfStack_b50 = (fdb_kvs_handle *)0x112c97;
  fVar4 = fdb_iterator_init(pfStack_b10,&pfStack_af8,(void *)0x0,0,(void *)0x0,0,0);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011311d;
  in_RCX = (fdb_kvs_handle *)0x0;
  pfStack_b50 = (fdb_kvs_handle *)0x112cbf;
  fVar4 = fdb_iterator_init(pfStack_b18,&pfStack_b08,(void *)0x0,0,(void *)0x0,0,0);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113122;
  unaff_R12 = auStack_ab8;
  unaff_R13 = "value%08d";
  handle = "k%06d";
  uStack_b34 = 0;
  do {
    pfStack_b40 = (fdb_kvs_handle *)0x0;
    pfStack_b50 = (fdb_kvs_handle *)0x112cfd;
    fVar4 = fdb_iterator_get(pfStack_b30,(fdb_doc **)&pfStack_b40);
    uVar16 = uStack_b34;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00112ea7;
    pfStack_b50 = (fdb_kvs_handle *)0x112d1c;
    sprintf(unaff_R12,"k%05d",(ulong)uStack_b34);
    *(undefined4 *)&pfVar11->kvs_config = 0x78787878;
    *(undefined4 *)&(pfVar11->kvs_config).field_0x4 = 0x78787878;
    *(undefined4 *)&(pfVar11->kvs_config).custom_cmp = 0x78787878;
    *(undefined4 *)((long)&(pfVar11->kvs_config).custom_cmp + 4) = 0x78787878;
    *(undefined4 *)((long)&(pfVar11->kvs_config).custom_cmp + 2) = 0x78787878;
    *(undefined4 *)((long)&(pfVar11->kvs_config).custom_cmp + 6) = 0x78787878;
    *(undefined4 *)((long)&(pfVar11->kvs_config).custom_cmp_param + 2) = 0x78787878;
    *(undefined4 *)((long)&(pfVar11->kvs_config).custom_cmp_param + 6) = 0x78787878;
    *(undefined2 *)(puStack_b20 + 1) = 0x3e;
    *puStack_b20 = 0x646e653c;
    pfStack_b50 = (fdb_kvs_handle *)0x112d4a;
    sprintf((char *)pfVar11,"value%08d",(ulong)uVar16);
    pfVar12 = pfStack_b40;
    unaff_RBP._M_i = (__int_type)pfStack_b40->op_stats;
    pfStack_b50 = (fdb_kvs_handle *)0x112d61;
    iVar5 = bcmp((void *)unaff_RBP._M_i,unaff_R12,*(size_t *)&pfStack_b40->kvs_config);
    if (iVar5 != 0) goto LAB_0011307c;
    unaff_RBP._M_i = (__int_type)(pfVar12->field_6).seqtree;
    pfStack_b50 = (fdb_kvs_handle *)0x112d7c;
    iVar5 = bcmp((void *)unaff_RBP._M_i,pfVar11,(size_t)(pfVar12->kvs_config).custom_cmp_param);
    pcVar15 = (char *)pfVar12;
    if (iVar5 != 0) goto LAB_001130ac;
    pfStack_b50 = (fdb_kvs_handle *)0x112d8c;
    fdb_doc_free((fdb_doc *)pfVar12);
    pfStack_b40 = (fdb_kvs_handle *)0x0;
    pfStack_b50 = (fdb_kvs_handle *)0x112da4;
    fVar4 = fdb_iterator_get(pfStack_b30,(fdb_doc **)&pfStack_b40);
    pcVar15 = (char *)pfStack_b40;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011308c;
    unaff_RBP._M_i = (__int_type)pfStack_b40->op_stats;
    pfStack_b50 = (fdb_kvs_handle *)0x112dc3;
    iVar5 = bcmp((void *)unaff_RBP._M_i,unaff_R12,*(size_t *)&pfStack_b40->kvs_config);
    if (iVar5 != 0) goto LAB_00113091;
    unaff_RBP._M_i = (__int_type)(((fdb_kvs_handle *)pcVar15)->field_6).seqtree;
    pfStack_b50 = (fdb_kvs_handle *)0x112dde;
    iVar5 = bcmp((void *)unaff_RBP._M_i,pfVar11,
                 (size_t)(((fdb_kvs_handle *)pcVar15)->kvs_config).custom_cmp_param);
    if (iVar5 != 0) goto LAB_001130a1;
    uVar16 = uStack_b34 + 1;
    pfStack_b50 = (fdb_kvs_handle *)0x112df4;
    fdb_doc_free((fdb_doc *)pcVar15);
    uStack_b34 = uVar16;
    if (uVar16 == 0x3c) {
      pcVar15 = (char *)0x0;
      do {
        pfStack_b50 = (fdb_kvs_handle *)0x112e10;
        sprintf(unaff_R12,"k%06d",pcVar15);
        *(undefined4 *)&pfVar11->kvs_config = 0x78787878;
        *(undefined4 *)&(pfVar11->kvs_config).field_0x4 = 0x78787878;
        *(undefined4 *)&(pfVar11->kvs_config).custom_cmp = 0x78787878;
        *(undefined4 *)((long)&(pfVar11->kvs_config).custom_cmp + 4) = 0x78787878;
        *(undefined4 *)((long)&(pfVar11->kvs_config).custom_cmp + 2) = 0x78787878;
        *(undefined4 *)((long)&(pfVar11->kvs_config).custom_cmp + 6) = 0x78787878;
        *(undefined4 *)((long)&(pfVar11->kvs_config).custom_cmp_param + 2) = 0x78787878;
        *(undefined4 *)((long)&(pfVar11->kvs_config).custom_cmp_param + 6) = 0x78787878;
        *(undefined2 *)(puStack_b20 + 1) = 0x3e;
        *puStack_b20 = 0x646e653c;
        pfStack_b50 = (fdb_kvs_handle *)0x112e3f;
        sprintf((char *)pfVar11,"value%08d",pcVar15);
        unaff_RBP._M_i = (__int_type)pfStack_b18;
        pfStack_b50 = (fdb_kvs_handle *)0x112e4c;
        sVar7 = strlen(unaff_R12);
        pfStack_b50 = (fdb_kvs_handle *)0x112e64;
        in_RCX = pfVar11;
        fVar4 = fdb_set_kv((fdb_kvs_handle *)unaff_RBP._M_i,unaff_R12,sVar7 + 1,pfVar11,0x20);
        if (fVar4 != FDB_RESULT_SUCCESS) {
          pfStack_b50 = (fdb_kvs_handle *)0x113057;
          in_memory_snapshot_on_dirty_hbtrie_test();
          goto LAB_00113057;
        }
        uVar16 = (int)pcVar15 + 1;
        pcVar15 = (char *)(ulong)uVar16;
      } while (uVar16 != 3000);
    }
    pfStack_b50 = (fdb_kvs_handle *)0x112e82;
    fVar6 = fdb_iterator_next(pfStack_b30);
    unaff_RBP._M_i = (__int_type)(uint)fVar6;
    pfStack_b50 = (fdb_kvs_handle *)0x112e8e;
    fVar4 = fdb_iterator_next(pfStack_af8);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00112e9f;
  } while (fVar4 == FDB_RESULT_SUCCESS);
  pfStack_b50 = (fdb_kvs_handle *)0x112e9f;
  in_memory_snapshot_on_dirty_hbtrie_test();
  fVar4 = extraout_EAX;
LAB_00112e9f:
  if (fVar4 != FDB_RESULT_SUCCESS) {
LAB_00112ea7:
    if (uStack_b34 != 300) goto LAB_00113127;
    pfStack_b50 = (fdb_kvs_handle *)0x112ebf;
    fVar4 = fdb_iterator_close(pfStack_b30);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011312c;
    pfStack_b50 = (fdb_kvs_handle *)0x112ed1;
    fVar4 = fdb_iterator_close(pfStack_af8);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113131;
    unaff_R12 = auStack_ab8;
    unaff_R13 = "value%08d";
    unaff_RBP._M_i = 0;
    do {
      pfStack_b40 = (fdb_kvs_handle *)0x0;
      pfStack_b50 = (fdb_kvs_handle *)0x112f02;
      fVar4 = fdb_iterator_get(pfStack_b08,(fdb_doc **)&pfStack_b40);
      if (fVar4 != FDB_RESULT_SUCCESS) break;
      pfStack_b50 = (fdb_kvs_handle *)0x112f1d;
      sprintf(unaff_R12,"k%05d",unaff_RBP._M_i);
      *(undefined4 *)&pfVar11->kvs_config = 0x78787878;
      *(undefined4 *)&(pfVar11->kvs_config).field_0x4 = 0x78787878;
      *(undefined4 *)&(pfVar11->kvs_config).custom_cmp = 0x78787878;
      *(undefined4 *)((long)&(pfVar11->kvs_config).custom_cmp + 4) = 0x78787878;
      *(undefined4 *)((long)&(pfVar11->kvs_config).custom_cmp + 2) = 0x78787878;
      *(undefined4 *)((long)&(pfVar11->kvs_config).custom_cmp + 6) = 0x78787878;
      *(undefined4 *)((long)&(pfVar11->kvs_config).custom_cmp_param + 2) = 0x78787878;
      *(undefined4 *)((long)&(pfVar11->kvs_config).custom_cmp_param + 6) = 0x78787878;
      *(undefined2 *)(puStack_b20 + 1) = 0x3e;
      *puStack_b20 = 0x646e653c;
      pfStack_b50 = (fdb_kvs_handle *)0x112f4b;
      sprintf((char *)pfVar11,"value%08d",unaff_RBP._M_i);
      pcVar15 = (char *)pfStack_b40;
      handle = (char *)pfStack_b40->op_stats;
      pfStack_b50 = (fdb_kvs_handle *)0x112f62;
      iVar5 = bcmp(handle,unaff_R12,*(size_t *)&pfStack_b40->kvs_config);
      if (iVar5 != 0) goto LAB_001130b7;
      handle = (char *)(((fdb_kvs_handle *)pcVar15)->field_6).seqtree;
      pfStack_b50 = (fdb_kvs_handle *)0x112f7d;
      iVar5 = bcmp(handle,pfVar11,(size_t)(((fdb_kvs_handle *)pcVar15)->kvs_config).custom_cmp_param
                  );
      if (iVar5 != 0) goto LAB_001130c7;
      unaff_RBP._M_i = (__int_type)((int)unaff_RBP._M_i + 1);
      pfStack_b50 = (fdb_kvs_handle *)0x112f8f;
      fdb_doc_free((fdb_doc *)pcVar15);
      pfStack_b50 = (fdb_kvs_handle *)0x112f99;
      fVar4 = fdb_iterator_next(pfStack_b08);
    } while (fVar4 == FDB_RESULT_SUCCESS);
    if ((int)unaff_RBP._M_i != 300) goto LAB_00113136;
    pfStack_b50 = (fdb_kvs_handle *)0x112fb7;
    fVar4 = fdb_iterator_close(pfStack_b08);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011313b;
    pfStack_b50 = (fdb_kvs_handle *)0x112fc9;
    fVar4 = fdb_kvs_close(pfStack_b28);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113140;
    pfStack_b50 = (fdb_kvs_handle *)0x112fdb;
    fVar4 = fdb_kvs_close(pfStack_b10);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113145;
    pfStack_b50 = (fdb_kvs_handle *)0x112fed;
    fVar4 = fdb_close(pfStack_b00);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011314a;
    pfStack_b50 = (fdb_kvs_handle *)0x112ffa;
    fVar4 = fdb_shutdown();
    if (fVar4 == FDB_RESULT_SUCCESS) {
      pfStack_b50 = (fdb_kvs_handle *)0x11300a;
      free(pfVar11);
      pfStack_b50 = (fdb_kvs_handle *)0x11300f;
      memleak_end();
      pcVar15 = "%s PASSED\n";
      if (in_memory_snapshot_on_dirty_hbtrie_test()::__test_pass != '\0') {
        pcVar15 = "%s FAILED\n";
      }
      pfStack_b50 = (fdb_kvs_handle *)0x113040;
      fprintf(_stderr,pcVar15,"in-memory snapshot on dirty HB+trie nodes test");
      return;
    }
    goto LAB_0011314f;
  }
  goto LAB_00113154;
LAB_00113614:
  pfStack_f68 = (fdb_kvs_handle *)0x113624;
  in_memory_snapshot_compaction_test();
LAB_00113624:
  pfStack_f68 = (fdb_kvs_handle *)0x11362f;
  in_memory_snapshot_compaction_test();
LAB_0011362f:
  pfStack_f68 = (fdb_kvs_handle *)0x11363f;
  in_memory_snapshot_compaction_test();
LAB_0011363f:
  pfStack_f68 = (fdb_kvs_handle *)0x11364a;
  in_memory_snapshot_compaction_test();
  goto LAB_0011364a;
LAB_00113ba0:
  pcStack_1220 = (code *)0x113bb0;
  cb_inmem_snap();
LAB_00113bb0:
  pcStack_1220 = (code *)0x113bc0;
  cb_inmem_snap();
LAB_00113bc0:
  pcStack_1220 = (code *)0x113bd0;
  cb_inmem_snap();
LAB_00113bd0:
  _Var10._M_i = (__int_type)(auStack_1198 + 0x100);
  __s = (fdb_kvs_handle *)auStack_1198;
  pcStack_1220 = (code *)0x113be0;
  cb_inmem_snap();
  goto LAB_00113be0;
LAB_00114672:
  pfStack_1798 = (fdb_iterator *)0x11467d;
  snapshot_clone_test();
  pfVar14 = pfVar13;
LAB_0011467d:
  pfVar13 = pfVar14;
  pfStack_1798 = (fdb_iterator *)0x114682;
  snapshot_clone_test();
LAB_00114682:
  pfStack_1798 = (fdb_iterator *)0x11468d;
  snapshot_clone_test();
LAB_0011468d:
  pfVar12 = (fdb_kvs_handle *)&pfStack_1780;
  pfStack_1798 = (fdb_iterator *)0x114698;
  snapshot_clone_test();
  goto LAB_00114698;
LAB_00113057:
  pfStack_b50 = (fdb_kvs_handle *)0x11305c;
  in_memory_snapshot_on_dirty_hbtrie_test();
  pfVar12 = (fdb_kvs_handle *)pcVar15;
LAB_0011305c:
  pfStack_b50 = (fdb_kvs_handle *)0x113061;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113061:
  pfStack_b50 = (fdb_kvs_handle *)0x113071;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113071:
  pfStack_b50 = (fdb_kvs_handle *)0x11307c;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011307c:
  pfStack_b50 = (fdb_kvs_handle *)0x11308c;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011308c:
  pcVar15 = (char *)pfVar12;
  pfStack_b50 = (fdb_kvs_handle *)0x113091;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113091:
  pfStack_b50 = (fdb_kvs_handle *)0x1130a1;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130a1:
  pfStack_b50 = (fdb_kvs_handle *)0x1130ac;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130ac:
  pfStack_b50 = (fdb_kvs_handle *)0x1130b7;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130b7:
  pfStack_b50 = (fdb_kvs_handle *)0x1130c7;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130c7:
  pfStack_b50 = (fdb_kvs_handle *)0x1130d2;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130d2:
  pfStack_b50 = (fdb_kvs_handle *)0x1130d7;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130d7:
  pfStack_b50 = (fdb_kvs_handle *)0x1130dc;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130dc:
  pfStack_b50 = (fdb_kvs_handle *)0x1130e1;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130e1:
  pfStack_b50 = (fdb_kvs_handle *)0x1130e6;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130e6:
  pfStack_b50 = (fdb_kvs_handle *)0x1130eb;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130eb:
  pfVar12 = (fdb_kvs_handle *)pcVar15;
  pfStack_b50 = (fdb_kvs_handle *)0x1130f0;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130f0:
  pfStack_b50 = (fdb_kvs_handle *)0x1130f5;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130f5:
  pfStack_b50 = (fdb_kvs_handle *)0x1130fa;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130fa:
  pfStack_b50 = (fdb_kvs_handle *)0x1130ff;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130ff:
  pfStack_b50 = (fdb_kvs_handle *)0x113104;
  in_memory_snapshot_on_dirty_hbtrie_test();
  pcVar15 = (char *)pfVar12;
LAB_00113104:
  pfStack_b50 = (fdb_kvs_handle *)0x113109;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113109:
  pfStack_b50 = (fdb_kvs_handle *)0x11310e;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011310e:
  pfStack_b50 = (fdb_kvs_handle *)0x113113;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113113:
  pfStack_b50 = (fdb_kvs_handle *)0x113118;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113118:
  pfStack_b50 = (fdb_kvs_handle *)0x11311d;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011311d:
  pfStack_b50 = (fdb_kvs_handle *)0x113122;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113122:
  pfStack_b50 = (fdb_kvs_handle *)0x113127;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113127:
  pfStack_b50 = (fdb_kvs_handle *)0x11312c;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011312c:
  pfStack_b50 = (fdb_kvs_handle *)0x113131;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113131:
  pfStack_b50 = (fdb_kvs_handle *)0x113136;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113136:
  pfStack_b50 = (fdb_kvs_handle *)0x11313b;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011313b:
  pfStack_b50 = (fdb_kvs_handle *)0x113140;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113140:
  pfStack_b50 = (fdb_kvs_handle *)0x113145;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113145:
  pfStack_b50 = (fdb_kvs_handle *)0x11314a;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011314a:
  pfStack_b50 = (fdb_kvs_handle *)0x11314f;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011314f:
  pfStack_b50 = (fdb_kvs_handle *)0x113154;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113154:
  pfStack_b50 = (fdb_kvs_handle *)in_memory_snapshot_compaction_test;
  in_memory_snapshot_on_dirty_hbtrie_test();
  pfStack_f68 = (fdb_kvs_handle *)0x113179;
  pfStack_b78 = pfVar11;
  pfStack_b70 = (fdb_kvs_handle *)unaff_R12;
  pfStack_b68 = (fdb_kvs_handle *)unaff_R13;
  pfStack_b60 = (fdb_kvs_handle *)pcVar15;
  pfStack_b58 = (fdb_kvs_handle *)handle;
  pfStack_b50 = (fdb_kvs_handle *)unaff_RBP._M_i;
  gettimeofday(&tStack_e90,(__timezone_ptr_t)0x0);
  auStack_f58._4_2_ = 100;
  auStack_f58._0_4_ = 0x3530256b;
  auStack_f30._8_2_ = 100;
  auStack_f30._0_8_ = 0x38302565756c6176;
  builtin_strncpy(acStack_c78,"mvcc_test* > errorlog.txt",0x1a);
  pfStack_c80 = (fdb_kvs_handle *)0x202066722d206d72;
  pfStack_f68 = (fdb_kvs_handle *)0x1131c6;
  system((char *)&pfStack_c80);
  pfStack_f68 = (fdb_kvs_handle *)0x1131cb;
  memleak_start();
  pfStack_f68 = (fdb_kvs_handle *)0x1131d5;
  pfVar12 = (fdb_kvs_handle *)malloc(0x20);
  pfVar11 = (fdb_kvs_handle *)((long)apbStack_e80 + 0x108);
  pfStack_f68 = (fdb_kvs_handle *)0x1131e8;
  fdb_get_default_config();
  uStack_d58 = 0x201;
  auStack_d78[0x18] = '\x01';
  auStack_d78._16_8_ = (fdb_txn *)0x2;
  uStack_d38 = 1;
  auStack_d78._8_8_ = (fdb_log_callback)0x0;
  pcStack_d20 = cb_inmem_snap;
  uStack_d18 = 2;
  pfStack_d10 = (fdb_txn *)auStack_f00;
  pfStack_f68 = (fdb_kvs_handle *)0x113232;
  fdb_get_default_kvs_config();
  pfStack_f68 = (fdb_kvs_handle *)0x113246;
  fVar4 = fdb_open(&pfStack_f50,"./mvcc_test",(fdb_config *)pfVar11);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    in_RCX = (fdb_kvs_handle *)(auStack_f00 + 0x28);
    pfStack_f68 = (fdb_kvs_handle *)0x11326c;
    fVar4 = fdb_kvs_open(pfStack_f50,(fdb_kvs_handle **)(auStack_f30 + 0x10),"db",
                         (fdb_kvs_config *)in_RCX);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011364f;
    in_RCX = (fdb_kvs_handle *)(auStack_f00 + 0x28);
    pfStack_f68 = (fdb_kvs_handle *)0x113292;
    fVar4 = fdb_kvs_open(pfStack_f50,(fdb_kvs_handle **)(auStack_f30 + 0x18),"db",
                         (fdb_kvs_config *)in_RCX);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113654;
    auStack_f00._0_8_ = auStack_f30._24_8_;
    auStack_f00._8_8_ = (btree *)0xa;
    auStack_f00._24_8_ = auStack_f58;
    handle = auStack_f30;
    auStack_f00._16_4_ = 0x20;
    pfVar11 = (fdb_kvs_handle *)((long)&pfVar12->kvs + 2);
    unaff_R12 = (char *)apbStack_e80;
    unaff_RBP._M_i = 0;
    auStack_f00._32_8_ = handle;
    do {
      pfStack_f68 = (fdb_kvs_handle *)0x1132ee;
      sprintf(unaff_R12,auStack_f58,unaff_RBP._M_i);
      *(undefined4 *)&pfVar12->kvs_config = 0x78787878;
      *(undefined4 *)&(pfVar12->kvs_config).field_0x4 = 0x78787878;
      *(undefined4 *)&(pfVar12->kvs_config).custom_cmp = 0x78787878;
      *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp + 4) = 0x78787878;
      *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp + 2) = 0x78787878;
      *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp + 6) = 0x78787878;
      *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp_param + 2) = 0x78787878;
      *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp_param + 6) = 0x78787878;
      *(undefined2 *)((long)&pfVar12->kvs + 6) = 0x3e;
      *(undefined4 *)&pfVar11->kvs_config = 0x646e653c;
      pfStack_f68 = (fdb_kvs_handle *)0x113319;
      sprintf((char *)pfVar12,handle,unaff_RBP._M_i);
      unaff_R13 = (char *)auStack_f30._16_8_;
      pfStack_f68 = (fdb_kvs_handle *)0x113326;
      sVar7 = strlen(unaff_R12);
      pfStack_f68 = (fdb_kvs_handle *)0x11333e;
      in_RCX = pfVar12;
      fVar4 = fdb_set_kv((fdb_kvs_handle *)unaff_R13,unaff_R12,sVar7 + 1,pfVar12,0x20);
      if (fVar4 != FDB_RESULT_SUCCESS) {
        pfStack_f68 = (fdb_kvs_handle *)0x113614;
        in_memory_snapshot_compaction_test();
        goto LAB_00113614;
      }
      uVar16 = (int)unaff_RBP._M_i + 1;
      unaff_RBP._M_i = (__int_type)uVar16;
    } while (uVar16 != 10);
    pfStack_f68 = (fdb_kvs_handle *)0x11335c;
    fVar4 = fdb_commit(pfStack_f50,'\x01');
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113659;
    pfStack_f68 = (fdb_kvs_handle *)0x113375;
    fVar4 = fdb_compact(pfStack_f50,"./mvcc_test2");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011365e;
    pfStack_f68 = (fdb_kvs_handle *)0x113393;
    fVar4 = fdb_snapshot_open((fdb_kvs_handle *)auStack_f30._16_8_,&pfStack_f48,0xffffffffffffffff);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113663;
    pfStack_f68 = (fdb_kvs_handle *)0x1133ad;
    fVar4 = fdb_get_kvs_info(pfStack_f48,(fdb_kvs_info *)&phStack_ec0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113668;
    if (pkStack_eb8 != (kvs_ops_stat *)0xb) {
      pfStack_f68 = (fdb_kvs_handle *)0x1133cd;
      in_memory_snapshot_compaction_test();
    }
    in_RCX = (fdb_kvs_handle *)0x0;
    pfStack_f68 = (fdb_kvs_handle *)0x1133ed;
    fVar4 = fdb_iterator_init(pfStack_f48,&pfStack_f38,(void *)0x0,0,(void *)0x0,0,0);
    __s = (fdb_kvs_handle *)unaff_R12;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011366d;
    handle = (char *)apbStack_e80;
    unaff_RBP._M_i = 0;
    do {
      pfStack_f40 = (fdb_kvs_handle *)0x0;
      pfStack_f68 = (fdb_kvs_handle *)0x113417;
      fVar4 = fdb_iterator_get(pfStack_f38,(fdb_doc **)&pfStack_f40);
      unaff_R12 = (char *)pfStack_f40;
      if (fVar4 != FDB_RESULT_SUCCESS) break;
      if ((uint)unaff_RBP._M_i < 10) {
        pfStack_f68 = (fdb_kvs_handle *)0x113435;
        sprintf(handle,auStack_f58,unaff_RBP._M_i);
        *(undefined4 *)&pfVar12->kvs_config = 0x78787878;
        *(undefined4 *)&(pfVar12->kvs_config).field_0x4 = 0x78787878;
        *(undefined4 *)&(pfVar12->kvs_config).custom_cmp = 0x78787878;
        *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp + 4) = 0x78787878;
        *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp + 2) = 0x78787878;
        *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp + 6) = 0x78787878;
        *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp_param + 2) = 0x78787878;
        *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp_param + 6) = 0x78787878;
        *(undefined2 *)((long)&pfVar12->kvs + 6) = 0x3e;
        *(undefined4 *)&pfVar11->kvs_config = 0x646e653c;
        pfStack_f68 = (fdb_kvs_handle *)0x113462;
        sprintf((char *)pfVar12,auStack_f30,unaff_RBP._M_i);
        unaff_R12 = (char *)pfStack_f40;
        unaff_R13 = (char *)pfStack_f40->op_stats;
        pfStack_f68 = (fdb_kvs_handle *)0x11347b;
        iVar5 = bcmp(unaff_R13,handle,(size_t)*(fdb_doc **)&pfStack_f40->kvs_config);
        if (iVar5 != 0) goto LAB_0011362f;
        unaff_R13 = (char *)(((fdb_kvs_handle *)unaff_R12)->field_6).seqtree;
        pfStack_f68 = (fdb_kvs_handle *)0x113498;
        iVar5 = bcmp(unaff_R13,pfVar12,
                     (size_t)(((fdb_kvs_handle *)unaff_R12)->kvs_config).custom_cmp_param);
        if (iVar5 != 0) goto LAB_0011363f;
      }
      else {
        apbStack_e80[0] = (btreeblk_handle *)0x79656b5f77656e;
        *(fdb_doc **)&pfVar12->kvs_config = (fdb_doc *)0x756c61765f77656e;
        *(undefined2 *)&(pfVar12->kvs_config).custom_cmp = 0x65;
        unaff_R13 = (char *)pfStack_f40->op_stats;
        pfStack_f68 = (fdb_kvs_handle *)0x1134df;
        iVar5 = bcmp(unaff_R13,handle,(size_t)*(fdb_doc **)&pfStack_f40->kvs_config);
        if (iVar5 != 0) goto LAB_00113614;
        unaff_R13 = (char *)(((fdb_kvs_handle *)unaff_R12)->field_6).seqtree;
        pfStack_f68 = (fdb_kvs_handle *)0x1134fc;
        iVar5 = bcmp(unaff_R13,pfVar12,
                     (size_t)(((fdb_kvs_handle *)unaff_R12)->kvs_config).custom_cmp_param);
        if (iVar5 != 0) goto LAB_00113624;
      }
      unaff_RBP._M_i = (__int_type)((uint)unaff_RBP._M_i + 1);
      pfStack_f68 = (fdb_kvs_handle *)0x11350e;
      fdb_doc_free((fdb_doc *)unaff_R12);
      pfStack_f68 = (fdb_kvs_handle *)0x113518;
      fVar4 = fdb_iterator_next(pfStack_f38);
      __s = (fdb_kvs_handle *)unaff_R12;
    } while (fVar4 == FDB_RESULT_SUCCESS);
    if ((int)unaff_RBP._M_i != 0xb) goto LAB_00113672;
    pfStack_f68 = (fdb_kvs_handle *)0x113533;
    fVar4 = fdb_iterator_close(pfStack_f38);
    pfVar13 = pfStack_f48;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113677;
    handle = (char *)apbStack_e80;
    pfStack_f68 = (fdb_kvs_handle *)0x113550;
    sVar7 = strlen(handle);
    in_RCX = (fdb_kvs_handle *)(auStack_f30 + 0x28);
    pfStack_f68 = (fdb_kvs_handle *)0x113569;
    fVar4 = fdb_get_kv(pfVar13,handle,sVar7 + 1,(void **)in_RCX,(size_t *)(auStack_f30 + 0x20));
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011367c;
    pfStack_f68 = (fdb_kvs_handle *)0x113586;
    pfVar11 = pfVar12;
    iVar5 = bcmp((void *)auStack_f30._40_8_,pfVar12,auStack_f30._32_8_);
    pfVar13 = (fdb_kvs_handle *)auStack_f30._40_8_;
    if (iVar5 != 0) goto LAB_00113681;
    pfStack_f68 = (fdb_kvs_handle *)0x113596;
    fdb_free_block((void *)auStack_f30._40_8_);
    pfStack_f68 = (fdb_kvs_handle *)0x1135a0;
    fdb_kvs_close(pfStack_f48);
    pfStack_f68 = (fdb_kvs_handle *)0x1135aa;
    fVar4 = fdb_close(pfStack_f50);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011368c;
    pfStack_f68 = (fdb_kvs_handle *)0x1135b7;
    fVar4 = fdb_shutdown();
    if (fVar4 == FDB_RESULT_SUCCESS) {
      pfStack_f68 = (fdb_kvs_handle *)0x1135c7;
      free(pfVar12);
      pfStack_f68 = (fdb_kvs_handle *)0x1135cc;
      memleak_end();
      pcVar15 = "%s PASSED\n";
      if (in_memory_snapshot_compaction_test()::__test_pass != '\0') {
        pcVar15 = "%s FAILED\n";
      }
      pfStack_f68 = (fdb_kvs_handle *)0x1135fd;
      fprintf(_stderr,pcVar15,"in-memory snapshot with concurrent compaction test");
      return;
    }
  }
  else {
LAB_0011364a:
    pfStack_f68 = (fdb_kvs_handle *)0x11364f;
    in_memory_snapshot_compaction_test();
LAB_0011364f:
    pfStack_f68 = (fdb_kvs_handle *)0x113654;
    in_memory_snapshot_compaction_test();
LAB_00113654:
    pfStack_f68 = (fdb_kvs_handle *)0x113659;
    in_memory_snapshot_compaction_test();
LAB_00113659:
    pfStack_f68 = (fdb_kvs_handle *)0x11365e;
    in_memory_snapshot_compaction_test();
LAB_0011365e:
    pfStack_f68 = (fdb_kvs_handle *)0x113663;
    in_memory_snapshot_compaction_test();
LAB_00113663:
    pfStack_f68 = (fdb_kvs_handle *)0x113668;
    in_memory_snapshot_compaction_test();
LAB_00113668:
    pfStack_f68 = (fdb_kvs_handle *)0x11366d;
    in_memory_snapshot_compaction_test();
    __s = (fdb_kvs_handle *)unaff_R12;
LAB_0011366d:
    pfStack_f68 = (fdb_kvs_handle *)0x113672;
    in_memory_snapshot_compaction_test();
LAB_00113672:
    pfStack_f68 = (fdb_kvs_handle *)0x113677;
    in_memory_snapshot_compaction_test();
LAB_00113677:
    pfVar13 = pfVar11;
    pfStack_f68 = (fdb_kvs_handle *)0x11367c;
    in_memory_snapshot_compaction_test();
LAB_0011367c:
    pfStack_f68 = (fdb_kvs_handle *)0x113681;
    in_memory_snapshot_compaction_test();
LAB_00113681:
    pfStack_f68 = (fdb_kvs_handle *)0x11368c;
    pfVar11 = pfVar13;
    in_memory_snapshot_compaction_test();
LAB_0011368c:
    pfStack_f68 = (fdb_kvs_handle *)0x113691;
    in_memory_snapshot_compaction_test();
  }
  pfStack_f68 = (fdb_kvs_handle *)cb_inmem_snap;
  in_memory_snapshot_compaction_test();
  uVar19 = (ulong)pfVar11 & 0xffffffff;
  _Var10._M_i = 0;
  pcStack_1220 = (code *)0x1136be;
  pfStack_f90 = pfVar12;
  pfStack_f88 = __s;
  pfStack_f80 = (fdb_kvs_handle *)unaff_R13;
  pfStack_f78 = pfVar13;
  pfStack_f70 = (fdb_kvs_handle *)handle;
  pfStack_f68 = (fdb_kvs_handle *)unaff_RBP._M_i;
  gettimeofday((timeval *)auStack_11a8,(__timezone_ptr_t)0x0);
  if ((int)pfVar11 != 2) {
    return;
  }
  __s_00 = extraout_RDX;
  if (extraout_RDX == (btree *)0x0) {
LAB_00113be0:
    pcStack_1220 = (code *)0x113be5;
    cb_inmem_snap();
LAB_00113be5:
    pcStack_1220 = (code *)0x113bea;
    cb_inmem_snap();
LAB_00113bea:
    pcStack_1220 = (code *)0x113bef;
    cb_inmem_snap();
LAB_00113bef:
    pcStack_1220 = (code *)0x113bf4;
    cb_inmem_snap();
LAB_00113bf4:
    pcStack_1220 = (code *)0x113bf9;
    cb_inmem_snap();
LAB_00113bf9:
    pcStack_1220 = (code *)0x113bfe;
    cb_inmem_snap();
LAB_00113bfe:
    pcStack_1220 = (code *)0x113c03;
    cb_inmem_snap();
    pfVar11 = (fdb_kvs_handle *)unaff_R13;
LAB_00113c03:
    pcStack_1220 = (code *)0x113c08;
    cb_inmem_snap();
LAB_00113c08:
    pfVar12 = in_RCX;
    pcStack_1220 = (code *)0x113c0d;
    cb_inmem_snap();
LAB_00113c0d:
    pcStack_1220 = (code *)0x113c12;
    cb_inmem_snap();
  }
  else {
    unaff_R13 = (char *)CONCAT26(auStack_f58._6_2_,CONCAT24(auStack_f58._4_2_,auStack_f58._0_4_));
    pfVar11 = (fdb_kvs_handle *)(ulong)*(byte *)&in_RCX->file;
    iVar5 = *(int *)((long)&(((atomic<unsigned_long> *)
                             &(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp)->
                            super___atomic_base<unsigned_long>)._M_i + 4);
    *(int *)((long)&(((atomic<unsigned_long> *)
                     &(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp)->
                    super___atomic_base<unsigned_long>)._M_i + 4) = iVar5 + 1;
    if (iVar5 != 4) {
      if (iVar5 != 1) {
        return;
      }
      pcStack_1220 = (code *)0x11370e;
      fVar4 = fdb_snapshot_open((fdb_kvs_handle *)
                                *(__atomic_base<unsigned_long> *)
                                 &((fdb_kvs_handle *)unaff_R13)->kvs_config,&pfStack_1208,
                                0xffffffffffffffff);
      _Var10._M_i = (__int_type)pfVar11;
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113be5;
      pcStack_1220 = (code *)0x113725;
      fVar4 = fdb_get_kvs_info(pfStack_1208,&fStack_11d8);
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113bef;
      in_RCX = (fdb_kvs_handle *)&(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp;
      if (fStack_11d8.last_seqnum !=
          (long)(int)(((atomic<unsigned_long> *)
                      &(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp)->
                     super___atomic_base<unsigned_long>)._M_i) {
        pcStack_1220 = (code *)0x113b4e;
        cb_inmem_snap();
      }
      pcStack_1220 = (code *)0x11376a;
      pfStack_11f8 = pfVar11;
      paStack_11f0 = (atomic<unsigned_long> *)in_RCX;
      fVar4 = fdb_iterator_init(pfStack_1208,&pfStack_1210,(void *)0x0,0,(void *)0x0,0,0);
      if (fVar4 == FDB_RESULT_SUCCESS) {
        __s_00 = (btree *)(auStack_11a8 + 10);
        uVar19 = 0;
        do {
          pfStack_1200 = (fdb_kvs_handle *)0x0;
          pcStack_1220 = (code *)0x1137a1;
          fVar4 = fdb_iterator_get(pfStack_1210,(fdb_doc **)&pfStack_1200);
          if (fVar4 != FDB_RESULT_SUCCESS) break;
          lVar18 = CONCAT26(auStack_f58._6_2_,CONCAT24(auStack_f58._4_2_,auStack_f58._0_4_));
          pcStack_1220 = (code *)0x1137c1;
          sprintf(auStack_1198 + 0x100,*(char **)(lVar18 + 0x18),uVar19);
          sVar7 = (size_t)*(int *)(lVar18 + 0x10);
          pcStack_1220 = (code *)0x1137d5;
          memset(auStack_1198,0x78,sVar7);
          *(undefined4 *)(&__s_00->ksize + sVar7) = 0x646e653c;
          *(undefined2 *)((long)&uStack_119a + sVar7) = 0x3e;
          pcStack_1220 = (code *)0x1137f5;
          sprintf(auStack_1198,*(char **)(lVar18 + 0x20),uVar19);
          unaff_R13 = (char *)pfStack_1200;
          in_RCX = (fdb_kvs_handle *)pfStack_1200->op_stats;
          pcStack_1220 = (code *)0x11380d;
          iVar5 = bcmp(in_RCX,auStack_1198 + 0x100,*(size_t *)&pfStack_1200->kvs_config);
          if (iVar5 != 0) {
            pcStack_1220 = (code *)0x113b90;
            cb_inmem_snap();
LAB_00113b90:
            pcStack_1220 = (code *)0x113ba0;
            cb_inmem_snap();
            goto LAB_00113ba0;
          }
          in_RCX = (fdb_kvs_handle *)(((fdb_kvs_handle *)unaff_R13)->field_6).seqtree;
          pcStack_1220 = (code *)0x113828;
          iVar5 = bcmp(in_RCX,auStack_1198,
                       (size_t)(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp_param);
          if (iVar5 != 0) goto LAB_00113b90;
          uVar19 = (ulong)((int)uVar19 + 1);
          pcStack_1220 = (code *)0x11383a;
          fdb_doc_free((fdb_doc *)unaff_R13);
          pcStack_1220 = (code *)0x113844;
          fVar4 = fdb_iterator_next(pfStack_1210);
        } while (fVar4 == FDB_RESULT_SUCCESS);
        if ((int)uVar19 != (int)(paStack_11f0->super___atomic_base<unsigned_long>)._M_i) {
          pcStack_1220 = (code *)0x113b6c;
          cb_inmem_snap();
        }
        pcStack_1220 = (code *)0x113863;
        fVar4 = fdb_iterator_close(pfStack_1210);
        pfVar11 = pfStack_11f8;
        if (fVar4 == FDB_RESULT_SUCCESS) goto LAB_00113b21;
        pcStack_1220 = (code *)0x113875;
        cb_inmem_snap();
        goto LAB_00113875;
      }
      goto LAB_00113bf9;
    }
LAB_00113875:
    in_RCX = (fdb_kvs_handle *)(auStack_1198 + 0x100);
    auStack_1198._256_4_ = 0x5f77656e;
    auStack_1198[0x104] = 'k';
    auStack_1198[0x105] = 'e';
    auStack_1198[0x106] = 'y';
    auStack_1198[0x107] = '\0';
    __s_00 = (btree *)auStack_1198;
    auStack_1198[0] = 'n';
    auStack_1198[1] = 'e';
    auStack_1198._2_2_ = 0x5f77;
    auStack_1198._4_4_ = 0x756c6176;
    auStack_1198._8_2_ = 0x65;
    _Var10._M_i = *(__int_type *)&((fdb_kvs_handle *)unaff_R13)->kvs_config;
    pcStack_1220 = (code *)0x1138b7;
    pfStack_11f8 = pfVar11;
    sVar7 = strlen((char *)in_RCX);
    __s = (fdb_kvs_handle *)(sVar7 + 1);
    pcStack_1220 = (code *)0x1138c3;
    sVar7 = strlen((char *)__s_00);
    pcStack_1220 = (code *)0x1138d8;
    fVar4 = fdb_set_kv((fdb_kvs_handle *)_Var10._M_i,in_RCX,(size_t)__s,__s_00,sVar7 + 1);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113bea;
    pcStack_1220 = (code *)0x1138f5;
    fVar4 = fdb_snapshot_open((fdb_kvs_handle *)
                              *(__atomic_base<unsigned_long> *)
                               &((fdb_kvs_handle *)unaff_R13)->kvs_config,&pfStack_1208,
                              0xffffffffffffffff);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113bf4;
    pcStack_1220 = (code *)0x11390c;
    fVar4 = fdb_get_kvs_info(pfStack_1208,&fStack_11d8);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113bfe;
    in_RCX = (fdb_kvs_handle *)&(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp;
    if (fStack_11d8.last_seqnum !=
        (long)(int)(((atomic<unsigned_long> *)
                    &(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp)->
                   super___atomic_base<unsigned_long>)._M_i + 1U) {
      pcStack_1220 = (code *)0x113b60;
      cb_inmem_snap();
    }
    pcStack_1220 = (code *)0x11394a;
    fVar4 = fdb_iterator_init(pfStack_1208,&pfStack_1210,(void *)0x0,0,(void *)0x0,0,0);
    pfVar11 = (fdb_kvs_handle *)unaff_R13;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113c03;
    pcVar15 = auStack_1198 + 0x100;
    __s = (fdb_kvs_handle *)auStack_1198;
    uVar19 = 0;
    do {
      pfStack_1200 = (fdb_kvs_handle *)0x0;
      pcStack_1220 = (code *)0x11397c;
      fVar4 = fdb_iterator_get(pfStack_1210,(fdb_doc **)&pfStack_1200);
      unaff_R13 = (char *)pfStack_1200;
      if (fVar4 != FDB_RESULT_SUCCESS) break;
      if ((int)uVar19 <
          (int)(((atomic<unsigned_long> *)in_RCX)->super___atomic_base<unsigned_long>)._M_i) {
        lVar18 = CONCAT26(auStack_f58._6_2_,CONCAT24(auStack_f58._4_2_,auStack_f58._0_4_));
        pcStack_1220 = (code *)0x1139a4;
        sprintf(pcVar15,*(char **)(lVar18 + 0x18),uVar19);
        sVar7 = (size_t)*(int *)(lVar18 + 0x10);
        pcStack_1220 = (code *)0x1139b8;
        memset(__s,0x78,sVar7);
        *(undefined4 *)(auStack_11a8 + sVar7 + 10) = 0x646e653c;
        *(undefined2 *)((long)&uStack_119a + sVar7) = 0x3e;
        pcStack_1220 = (code *)0x1139dd;
        sprintf((char *)__s,*(char **)(lVar18 + 0x20),uVar19);
        unaff_R13 = (char *)pfStack_1200;
        __s_00 = (btree *)(((atomic<unsigned_long> *)&pfStack_1200->op_stats)->
                          super___atomic_base<unsigned_long>)._M_i;
        pcStack_1220 = (code *)0x1139f5;
        iVar5 = bcmp(__s_00,pcVar15,
                     (__int_type)*(__atomic_base<unsigned_long> *)&pfStack_1200->kvs_config);
        if (iVar5 != 0) goto LAB_00113bb0;
        __s_00 = (((fdb_kvs_handle *)unaff_R13)->field_6).seqtree;
        pcStack_1220 = (code *)0x113a10;
        iVar5 = bcmp(__s_00,__s,
                     (((atomic<unsigned_long> *)
                      &(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp_param)->
                     super___atomic_base<unsigned_long>)._M_i);
        if (iVar5 != 0) goto LAB_00113bc0;
      }
      else {
        auStack_1198._256_4_ = 0x5f77656e;
        auStack_1198[0x104] = 'k';
        auStack_1198[0x105] = 'e';
        auStack_1198[0x106] = 'y';
        auStack_1198[0x107] = '\0';
        auStack_1198[0] = 'n';
        auStack_1198[1] = 'e';
        auStack_1198._2_2_ = 0x5f77;
        auStack_1198._4_4_ = 0x756c6176;
        auStack_1198._8_2_ = 0x65;
        __s_00 = (btree *)(((atomic<unsigned_long> *)&pfStack_1200->op_stats)->
                          super___atomic_base<unsigned_long>)._M_i;
        pcStack_1220 = (code *)0x113a5f;
        iVar5 = bcmp(__s_00,pcVar15,
                     (__int_type)*(__atomic_base<unsigned_long> *)&pfStack_1200->kvs_config);
        if (iVar5 != 0) goto LAB_00113bd0;
        __s_00 = (((fdb_kvs_handle *)unaff_R13)->field_6).seqtree;
        pcStack_1220 = (code *)0x113a7a;
        iVar5 = bcmp(__s_00,__s,
                     (((atomic<unsigned_long> *)
                      &(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp_param)->
                     super___atomic_base<unsigned_long>)._M_i);
        if (iVar5 != 0) goto LAB_00113ba0;
      }
      uVar19 = (ulong)((int)uVar19 + 1);
      pcStack_1220 = (code *)0x113a8c;
      fdb_doc_free((fdb_doc *)unaff_R13);
      pcStack_1220 = (code *)0x113a96;
      fVar4 = fdb_iterator_next(pfStack_1210);
      pfVar11 = (fdb_kvs_handle *)unaff_R13;
    } while (fVar4 == FDB_RESULT_SUCCESS);
    if ((int)uVar19 !=
        (int)(((atomic<unsigned_long> *)in_RCX)->super___atomic_base<unsigned_long>)._M_i + 1) {
      pcStack_1220 = (code *)0x113b7b;
      cb_inmem_snap();
    }
    pcStack_1220 = (code *)0x113ab4;
    fVar4 = fdb_iterator_close(pfStack_1210);
    _Var10._M_i = (__int_type)pfStack_11f8;
    pfVar12 = pfStack_1208;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113c08;
    __s_00 = (btree *)(auStack_1198 + 0x100);
    pcStack_1220 = (code *)0x113ad6;
    sVar7 = strlen((char *)__s_00);
    pcStack_1220 = (code *)0x113aef;
    fVar4 = fdb_get_kv(pfVar12,__s_00,sVar7 + 1,&pfStack_11e0,&sStack_11e8);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113c0d;
    pcStack_1220 = (code *)0x113b11;
    iVar5 = bcmp(pfStack_11e0,auStack_1198,sStack_11e8);
    pfVar12 = pfStack_11e0;
    if (iVar5 == 0) {
      pcStack_1220 = (code *)0x113b21;
      fdb_free_block(pfStack_11e0);
LAB_00113b21:
      pcStack_1220 = (code *)0x113b2b;
      fdb_kvs_close(pfStack_1208);
      return;
    }
  }
  pcStack_1220 = snapshot_clone_test;
  cb_inmem_snap();
  pfStack_1798 = (fdb_iterator *)0x113c42;
  fStack_1440.bub_ctx.space_used = (uint64_t)pfVar12;
  fStack_1440.bub_ctx.handle = __s;
  pfStack_1238 = pfVar11;
  pbStack_1230 = __s_00;
  pfStack_1228 = (fdb_kvs_handle *)_Var10._M_i;
  pcStack_1220 = (code *)uVar19;
  gettimeofday(&tStack_1668,(__timezone_ptr_t)0x0);
  pfStack_1798 = (fdb_iterator *)0x113c47;
  memleak_start();
  pfStack_1798 = (fdb_iterator *)0x113c56;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar13 = (fdb_kvs_handle *)&fStack_1440.config.encryption_key;
  pfStack_1798 = (fdb_iterator *)0x113c66;
  fdb_get_default_config();
  config = (fdb_iterator *)auStack_1658;
  pfStack_1798 = (fdb_iterator *)0x113c76;
  fdb_get_default_kvs_config();
  fStack_1440.config.encryption_key.bytes[4] = '\0';
  fStack_1440.config.encryption_key.bytes[5] = '\0';
  fStack_1440.config.encryption_key.bytes[6] = '\0';
  fStack_1440.config.encryption_key.bytes[7] = '\0';
  fStack_1440.config.encryption_key.bytes[8] = '\0';
  fStack_1440.config.encryption_key.bytes[9] = '\0';
  fStack_1440.config.encryption_key.bytes[10] = '\0';
  fStack_1440.config.encryption_key.bytes[0xb] = '\0';
  fStack_1440.config.encryption_key.bytes[0xc] = '\0';
  fStack_1440.config.encryption_key.bytes[0xd] = '\x04';
  fStack_1440.config.encryption_key.bytes[0xe] = '\0';
  fStack_1440.config.encryption_key.bytes[0xf] = '\0';
  fStack_1440.config.encryption_key.bytes[0x10] = '\0';
  fStack_1440.config.encryption_key.bytes[0x11] = '\0';
  fStack_1440.config.encryption_key.bytes[0x12] = '\0';
  fStack_1440.config.encryption_key.bytes[0x13] = '\0';
  fStack_1440.config.encryption_key.bytes[0x1c] = '\x01';
  fStack_1440.config._180_4_ = 1;
  fStack_1440.config.block_reusing_threshold._7_1_ = 0;
  pfStack_1798 = (fdb_iterator *)0x113ca0;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar12 = (fdb_kvs_handle *)(auStack_1778 + 0x10);
  pfStack_1798 = (fdb_iterator *)0x113cb7;
  fVar4 = fdb_open((fdb_file_handle **)pfVar12,"./mvcc_test1",(fdb_config *)pfVar13);
  doc_00 = (fdb_iterator *)(ulong)(uint)fVar4;
  pfStack_1798 = (fdb_iterator *)0x113cc9;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_1778._16_8_,&pfStack_1788,(fdb_kvs_config *)config);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pfStack_1798 = (fdb_iterator *)0x113ce2;
    fVar4 = fdb_snapshot_open(pfStack_1788,(fdb_kvs_handle **)(auStack_1778 + 8),0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011469d;
    pfStack_1798 = (fdb_iterator *)0x113cfc;
    fdb_get_kvs_info((fdb_kvs_handle *)auStack_1778._8_8_,(fdb_kvs_info *)(apfStack_16c8 + 6));
    if ((fdb_kvs_handle *)fStack_1698.last_seqnum != (fdb_kvs_handle *)0x0) {
      pfStack_1798 = (fdb_iterator *)0x113d0f;
      snapshot_clone_test();
    }
    pfVar12 = (fdb_kvs_handle *)auStack_1778;
    pfStack_1798 = (fdb_iterator *)0x113d32;
    fdb_iterator_init((fdb_kvs_handle *)auStack_1778._8_8_,(fdb_iterator **)pfVar12,(void *)0x0,0,
                      (void *)0x0,0,0);
    pfStack_1798 = (fdb_iterator *)0x113d3a;
    fVar4 = fdb_iterator_next((fdb_iterator *)auStack_1778._0_8_);
    pfVar14 = __s;
    if (fVar4 != FDB_RESULT_ITERATOR_FAIL) goto LAB_001146a2;
    pfStack_1798 = (fdb_iterator *)0x113d4d;
    fdb_iterator_close((fdb_iterator *)auStack_1778._0_8_);
    pfStack_1798 = (fdb_iterator *)0x113d57;
    fdb_kvs_close((fdb_kvs_handle *)auStack_1778._8_8_);
    lVar18 = 0;
    uVar19 = 0;
    do {
      pfStack_1798 = (fdb_iterator *)0x113d79;
      sprintf(auStack_1658 + 0x18,"key%d",uVar19 & 0xffffffff);
      pfStack_1798 = (fdb_iterator *)0x113d95;
      sprintf((char *)&fStack_1540,"meta%d",uVar19 & 0xffffffff);
      pfStack_1798 = (fdb_iterator *)0x113db1;
      sprintf((char *)&fStack_1440,"body%d",uVar19 & 0xffffffff);
      pfStack_1798 = (fdb_iterator *)0x113dc1;
      sVar7 = strlen(auStack_1658 + 0x18);
      pfStack_1798 = (fdb_iterator *)0x113dcc;
      sVar8 = strlen((char *)&fStack_1540);
      pfStack_1798 = (fdb_iterator *)0x113dd7;
      sVar9 = strlen((char *)&fStack_1440);
      pfStack_1798 = (fdb_iterator *)0x113dfc;
      fdb_doc_create((fdb_doc **)(auStack_1740 + lVar18),auStack_1658 + 0x18,sVar7,&fStack_1540,
                     sVar8,&fStack_1440,sVar9);
      pfStack_1798 = (fdb_iterator *)0x113e0b;
      fdb_set(pfStack_1788,*(fdb_doc **)(auStack_1740 + uVar19 * 8));
      uVar19 = uVar19 + 1;
      lVar18 = lVar18 + 8;
    } while (uVar19 != 5);
    pfStack_1798 = (fdb_iterator *)0x113e2b;
    fdb_commit((fdb_file_handle *)auStack_1778._16_8_,'\x01');
    uVar19 = 5;
    ppfVar21 = (fdb_doc **)(auStack_1740 + 0x28);
    do {
      pfStack_1798 = (fdb_iterator *)0x113e52;
      sprintf(auStack_1658 + 0x18,"key%d",uVar19 & 0xffffffff);
      pfStack_1798 = (fdb_iterator *)0x113e6e;
      sprintf((char *)&fStack_1540,"meta%d",uVar19 & 0xffffffff);
      pfStack_1798 = (fdb_iterator *)0x113e8a;
      sprintf((char *)&fStack_1440,"body%d",uVar19 & 0xffffffff);
      pfStack_1798 = (fdb_iterator *)0x113e92;
      sVar7 = strlen(auStack_1658 + 0x18);
      pfStack_1798 = (fdb_iterator *)0x113e9d;
      sVar8 = strlen((char *)&fStack_1540);
      pfStack_1798 = (fdb_iterator *)0x113ea8;
      sVar9 = strlen((char *)&fStack_1440);
      pfStack_1798 = (fdb_iterator *)0x113ec8;
      fdb_doc_create(ppfVar21,auStack_1658 + 0x18,sVar7,&fStack_1540,sVar8,&fStack_1440,sVar9);
      pfStack_1798 = (fdb_iterator *)0x113ed5;
      fdb_set(pfStack_1788,*ppfVar21);
      uVar19 = uVar19 + 1;
      ppfVar21 = ppfVar21 + 1;
    } while (uVar19 != 9);
    pfVar13 = (fdb_kvs_handle *)(auStack_1658 + 0x18);
    pfStack_1798 = (fdb_iterator *)0x113f04;
    sprintf((char *)pfVar13,"key%d",9);
    config = &fStack_1540;
    pfStack_1798 = (fdb_iterator *)0x113f22;
    sprintf((char *)config,"meta%d",9);
    pfVar14 = &fStack_1440;
    pfStack_1798 = (fdb_iterator *)0x113f40;
    sprintf((char *)pfVar14,"Body%d",9);
    pfVar12 = (fdb_kvs_handle *)(auStack_1740 + 0x48);
    pfStack_1798 = (fdb_iterator *)0x113f50;
    pfVar11 = (fdb_kvs_handle *)strlen((char *)pfVar13);
    pfStack_1798 = (fdb_iterator *)0x113f5b;
    doc_00 = (fdb_iterator *)strlen((char *)config);
    pfStack_1798 = (fdb_iterator *)0x113f66;
    sVar7 = strlen((char *)pfVar14);
    pfStack_1798 = (fdb_iterator *)0x113f81;
    fdb_doc_create((fdb_doc **)pfVar12,pfVar13,(size_t)pfVar11,config,(size_t)doc_00,pfVar14,sVar7);
    pfStack_1798 = (fdb_iterator *)0x113f8e;
    fdb_set(pfStack_1788,(fdb_doc *)auStack_1740._72_8_);
    pfStack_1798 = (fdb_iterator *)0x113f9a;
    fdb_commit((fdb_file_handle *)auStack_1778._16_8_,'\0');
    **(undefined1 **)(auStack_1740._72_8_ + 0x40) = 0x62;
    pfStack_1798 = (fdb_iterator *)0x113fb1;
    fdb_set(pfStack_1788,(fdb_doc *)auStack_1740._72_8_);
    pfStack_1798 = (fdb_iterator *)0x113fbd;
    fdb_commit((fdb_file_handle *)auStack_1778._16_8_,'\0');
    pfStack_1758 = *(fdb_kvs_handle **)(auStack_1740._72_8_ + 0x28);
    pfStack_1798 = (fdb_iterator *)0x113fdf;
    fVar4 = fdb_snapshot_open(pfStack_1788,&pfStack_1748,0xffffffffffffffff);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001146a7;
    pfStack_1798 = (fdb_iterator *)0x113ff9;
    fdb_set(pfStack_1788,(fdb_doc *)auStack_1740._72_8_);
    pfStack_1798 = (fdb_iterator *)0x114005;
    fdb_commit((fdb_file_handle *)auStack_1778._16_8_,'\0');
    uVar19 = 10;
    pfVar12 = (fdb_kvs_handle *)0x50;
    do {
      pfStack_1798 = (fdb_iterator *)0x11402c;
      sprintf(auStack_1658 + 0x18,"key%d",uVar19 & 0xffffffff);
      pfStack_1798 = (fdb_iterator *)0x114048;
      sprintf((char *)&fStack_1540,"meta%d",uVar19 & 0xffffffff);
      pfVar14 = &fStack_1440;
      pfStack_1798 = (fdb_iterator *)0x114064;
      sprintf((char *)pfVar14,"body%d",uVar19 & 0xffffffff);
      doc_00 = (fdb_iterator *)(auStack_1740 + (long)pfVar12);
      pfStack_1798 = (fdb_iterator *)0x114074;
      pfVar13 = (fdb_kvs_handle *)strlen(auStack_1658 + 0x18);
      pfStack_1798 = (fdb_iterator *)0x11407f;
      pfVar11 = (fdb_kvs_handle *)strlen((char *)&fStack_1540);
      pfStack_1798 = (fdb_iterator *)0x11408a;
      sVar7 = strlen((char *)pfVar14);
      pfStack_1798 = (fdb_iterator *)0x1140af;
      fdb_doc_create((fdb_doc **)doc_00,auStack_1658 + 0x18,(size_t)pfVar13,&fStack_1540,
                     (size_t)pfVar11,pfVar14,sVar7);
      pfStack_1798 = (fdb_iterator *)0x1140be;
      fdb_set(pfStack_1788,*(fdb_doc **)(auStack_1740 + uVar19 * 8));
      uVar19 = uVar19 + 1;
      pfVar12 = (fdb_kvs_handle *)((long)pfVar12 + 8);
    } while (uVar19 != 0xf);
    pfStack_1798 = (fdb_iterator *)0x1140de;
    fdb_commit((fdb_file_handle *)auStack_1778._16_8_,'\x01');
    pfStack_1798 = (fdb_iterator *)0x1140f6;
    fVar4 = fdb_set_log_callback(pfStack_1788,logCallbackFunc,"snapshot_clone_test");
    config = (fdb_iterator *)0xf;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001146ac;
    pfStack_1798 = (fdb_iterator *)0x114112;
    fVar4 = fdb_snapshot_open(pfStack_1788,(fdb_kvs_handle **)(auStack_1778 + 8),999999);
    pfVar13 = pfStack_1758;
    if (fVar4 != FDB_RESULT_NO_DB_INSTANCE) goto LAB_001146b1;
    pfStack_1798 = (fdb_iterator *)0x114132;
    fVar4 = fdb_snapshot_open(pfStack_1788,(fdb_kvs_handle **)(auStack_1778 + 8),
                              (fdb_seqnum_t)pfStack_1758);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001146b6;
    pfStack_1798 = (fdb_iterator *)0x11414c;
    fVar4 = fdb_snapshot_open((fdb_kvs_handle *)auStack_1778._8_8_,&pfStack_1760,
                              (fdb_seqnum_t)pfVar13);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001146bb;
    pfStack_1798 = (fdb_iterator *)0x11415e;
    fVar4 = fdb_kvs_close((fdb_kvs_handle *)auStack_1778._8_8_);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001146c0;
    pfStack_1798 = (fdb_iterator *)0x11417b;
    fdb_get_kvs_info(pfStack_1760,(fdb_kvs_info *)(apfStack_16c8 + 6));
    if ((fdb_kvs_handle *)fStack_1698.last_seqnum != pfVar13) {
      pfStack_1798 = (fdb_iterator *)0x114191;
      snapshot_clone_test();
    }
    uVar19 = 0xf;
    config = (fdb_iterator *)apfStack_16c8;
    do {
      pfStack_1798 = (fdb_iterator *)0x1141b9;
      sprintf(auStack_1658 + 0x18,"key%d",uVar19 & 0xffffffff);
      doc_00 = &fStack_1540;
      pfStack_1798 = (fdb_iterator *)0x1141d4;
      sprintf((char *)doc_00,"meta%d",uVar19 & 0xffffffff);
      pfVar13 = &fStack_1440;
      pfStack_1798 = (fdb_iterator *)0x1141ef;
      sprintf((char *)pfVar13,"body%d",uVar19 & 0xffffffff);
      pfStack_1798 = (fdb_iterator *)0x1141f7;
      pfVar14 = (fdb_kvs_handle *)strlen(auStack_1658 + 0x18);
      pfStack_1798 = (fdb_iterator *)0x114202;
      pfVar11 = (fdb_kvs_handle *)strlen((char *)doc_00);
      pfStack_1798 = (fdb_iterator *)0x11420d;
      sVar7 = strlen((char *)pfVar13);
      pfStack_1798 = (fdb_iterator *)0x11422d;
      fdb_doc_create((fdb_doc **)config,auStack_1658 + 0x18,(size_t)pfVar14,doc_00,(size_t)pfVar11,
                     pfVar13,sVar7);
      pfStack_1798 = (fdb_iterator *)0x11423a;
      fdb_set(pfStack_1788,*(fdb_doc **)config);
      uVar19 = uVar19 + 1;
      config = (fdb_iterator *)((long)config + 8);
    } while (uVar19 != 0x14);
    pfStack_1798 = (fdb_iterator *)0x114257;
    fdb_commit((fdb_file_handle *)auStack_1778._16_8_,'\0');
    pfStack_1798 = (fdb_iterator *)0x11426d;
    fVar4 = fdb_snapshot_open(pfStack_1748,&pfStack_1750,0xffffffffffffffff);
    pfVar12 = (fdb_kvs_handle *)0x14;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001146c5;
    pfVar12 = (fdb_kvs_handle *)&pfStack_1780;
    pfStack_1798 = (fdb_iterator *)0x1142b8;
    fdb_doc_create((fdb_doc **)pfVar12,
                   (void *)(*(size_t **)
                             (auStack_1740 + (((long)pfStack_1758 << 0x20) + 0x100000000 >> 0x1d)))
                           [4],
                   **(size_t **)
                     (auStack_1740 + (((long)pfStack_1758 << 0x20) + 0x100000000 >> 0x1d)),
                   (void *)0x0,0,(void *)0x0,0);
    pfStack_1798 = (fdb_iterator *)0x1142c5;
    fVar4 = fdb_get_metaonly(pfStack_1760,(fdb_doc *)pfStack_1780);
    if (fVar4 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001146ca;
    pfStack_1798 = (fdb_iterator *)0x1142db;
    fdb_doc_free((fdb_doc *)pfStack_1780);
    pfStack_1798 = (fdb_iterator *)0x1142ff;
    fdb_doc_create((fdb_doc **)&pfStack_1780,*(kvs_ops_stat **)(auStack_1740._40_8_ + 0x20),
                   (size_t)*(fdb_doc **)(fdb_kvs_config *)auStack_1740._40_8_,(void *)0x0,0,
                   (void *)0x0,0);
    pfStack_1798 = (fdb_iterator *)0x11430c;
    fVar4 = fdb_get_metaonly(pfStack_1760,(fdb_doc *)pfStack_1780);
    __s = (fdb_kvs_handle *)auStack_1740._40_8_;
    doc_01 = pfStack_1780;
    pfVar12 = (fdb_kvs_handle *)&pfStack_1780;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001146cf;
    pfVar13 = (fdb_kvs_handle *)pfStack_1780->op_stats;
    config = *(fdb_iterator **)(auStack_1740._40_8_ + 0x20);
    pfStack_1798 = (fdb_iterator *)0x114336;
    iVar5 = bcmp(pfVar13,config,(size_t)*(fdb_doc **)(fdb_kvs_config *)auStack_1740._40_8_);
    if (iVar5 != 0) goto LAB_001146d4;
    pfVar13 = (fdb_kvs_handle *)doc_01->staletree;
    config = *(fdb_iterator **)((long)__s + 0x38);
    pfStack_1798 = (fdb_iterator *)0x114357;
    iVar5 = bcmp(pfVar13,config,(size_t)(__s->kvs_config).custom_cmp);
    if (iVar5 != 0) goto LAB_001146df;
    pfStack_1798 = (fdb_iterator *)0x114367;
    fdb_doc_free((fdb_doc *)doc_01);
    pfStack_1798 = (fdb_iterator *)0x114388;
    fdb_doc_create((fdb_doc **)&pfStack_1780,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
    pfStack_1780->fhandle = (fdb_file_handle *)0x6;
    pfStack_1798 = (fdb_iterator *)0x11439d;
    fVar4 = fdb_get_byseq(pfStack_1760,(fdb_doc *)pfStack_1780);
    pfVar12 = pfStack_1780;
    doc_01 = (fdb_kvs_handle *)&pfStack_1780;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001146ea;
    pfVar13 = (fdb_kvs_handle *)pfStack_1780->op_stats;
    config = *(fdb_iterator **)(auStack_1740._40_8_ + 0x20);
    pfStack_1798 = (fdb_iterator *)0x1143c6;
    iVar5 = bcmp(pfVar13,config,*(size_t *)&pfStack_1780->kvs_config);
    __s = (fdb_kvs_handle *)auStack_1740._40_8_;
    if (iVar5 != 0) goto LAB_001146ef;
    pfVar13 = (fdb_kvs_handle *)(pfVar12->field_6).seqtree;
    config = (fdb_iterator *)
             ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_1740._40_8_ + 0x40))->
             seqtree;
    pfStack_1798 = (fdb_iterator *)0x1143e6;
    iVar5 = bcmp(pfVar13,config,(size_t)(pfVar12->kvs_config).custom_cmp_param);
    if (iVar5 != 0) goto LAB_001146fa;
    pfStack_1798 = (fdb_iterator *)0x1143f6;
    fdb_doc_free((fdb_doc *)pfVar12);
    pfVar12 = (fdb_kvs_handle *)&pfStack_1780;
    pfStack_1780 = (fdb_kvs_handle *)0x0;
    pfVar11 = (fdb_kvs_handle *)0x0;
    pfStack_1798 = (fdb_iterator *)0x114425;
    fdb_iterator_init(pfStack_1760,(fdb_iterator **)auStack_1778,(void *)0x0,0,(void *)0x0,0,0);
    pfVar14 = pfVar13;
    do {
      pfStack_1798 = (fdb_iterator *)0x114432;
      fVar4 = fdb_iterator_get((fdb_iterator *)auStack_1778._0_8_,(fdb_doc **)pfVar12);
      pfVar13 = pfStack_1780;
      if (fVar4 != FDB_RESULT_SUCCESS) {
LAB_00114657:
        pfStack_1798 = (fdb_iterator *)0x11465c;
        snapshot_clone_test();
        pfVar13 = pfVar14;
LAB_0011465c:
        pfStack_1798 = (fdb_iterator *)0x114667;
        snapshot_clone_test();
LAB_00114667:
        pfStack_1798 = (fdb_iterator *)0x114672;
        snapshot_clone_test();
        goto LAB_00114672;
      }
      config = (fdb_iterator *)pfStack_1780->op_stats;
      doc_00 = *(fdb_iterator **)(auStack_1740 + (long)pfVar11 * 8);
      __s = (fdb_kvs_handle *)doc_00->_seqnum;
      pfStack_1798 = (fdb_iterator *)0x11445a;
      iVar5 = bcmp(config,__s,*(size_t *)&pfStack_1780->kvs_config);
      pfVar14 = pfVar13;
      if (iVar5 != 0) {
        pfStack_1798 = (fdb_iterator *)0x114657;
        snapshot_clone_test();
        goto LAB_00114657;
      }
      config = (fdb_iterator *)pfVar13->staletree;
      __s = (fdb_kvs_handle *)doc_00->tree_cursor_start;
      pfStack_1798 = (fdb_iterator *)0x114479;
      iVar5 = bcmp(config,__s,(size_t)(pfVar13->kvs_config).custom_cmp);
      if (iVar5 != 0) goto LAB_00114667;
      config = (fdb_iterator *)(pfVar13->field_6).seqtree;
      __s = (fdb_kvs_handle *)doc_00->tree_cursor_prev;
      pfStack_1798 = (fdb_iterator *)0x114498;
      iVar5 = bcmp(config,__s,(size_t)(pfVar13->kvs_config).custom_cmp_param);
      if (iVar5 != 0) goto LAB_0011465c;
      pfStack_1798 = (fdb_iterator *)0x1144a8;
      fdb_doc_free((fdb_doc *)pfVar13);
      pfStack_1780 = (fdb_kvs_handle *)0x0;
      pfVar11 = (fdb_kvs_handle *)&(pfVar11->kvs_config).field_0x1;
      pfStack_1798 = (fdb_iterator *)0x1144be;
      pfVar17 = (fdb_iterator *)auStack_1778._0_8_;
      fVar4 = fdb_iterator_next((fdb_iterator *)auStack_1778._0_8_);
    } while (fVar4 == FDB_RESULT_SUCCESS);
    if ((int)pfVar11 == 10) {
      pfStack_1798 = (fdb_iterator *)0x1144dd;
      fdb_iterator_close((fdb_iterator *)auStack_1778._0_8_);
      pfVar11 = (fdb_kvs_handle *)0x0;
      pfStack_1798 = (fdb_iterator *)0x1144fe;
      fdb_iterator_init(pfStack_1750,(fdb_iterator **)auStack_1778,(void *)0x0,0,(void *)0x0,0,0);
      pfVar12 = (fdb_kvs_handle *)&pfStack_1780;
      do {
        pfStack_1798 = (fdb_iterator *)0x114510;
        fVar4 = fdb_iterator_get((fdb_iterator *)auStack_1778._0_8_,(fdb_doc **)pfVar12);
        pfVar13 = pfStack_1780;
        if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011467d;
        config = (fdb_iterator *)pfStack_1780->op_stats;
        doc_00 = *(fdb_iterator **)(auStack_1740 + (long)pfVar11 * 8);
        __s = (fdb_kvs_handle *)doc_00->_seqnum;
        pfStack_1798 = (fdb_iterator *)0x114538;
        iVar5 = bcmp(config,__s,*(size_t *)&pfStack_1780->kvs_config);
        if (iVar5 != 0) goto LAB_00114672;
        config = (fdb_iterator *)pfVar13->staletree;
        __s = (fdb_kvs_handle *)doc_00->tree_cursor_start;
        pfStack_1798 = (fdb_iterator *)0x114557;
        iVar5 = bcmp(config,__s,(size_t)(pfVar13->kvs_config).custom_cmp);
        if (iVar5 != 0) goto LAB_0011468d;
        config = (fdb_iterator *)(pfVar13->field_6).seqtree;
        __s = (fdb_kvs_handle *)doc_00->tree_cursor_prev;
        pfStack_1798 = (fdb_iterator *)0x114576;
        iVar5 = bcmp(config,__s,(size_t)(pfVar13->kvs_config).custom_cmp_param);
        if (iVar5 != 0) goto LAB_00114682;
        pfStack_1798 = (fdb_iterator *)0x114586;
        fdb_doc_free((fdb_doc *)pfVar13);
        pfStack_1780 = (fdb_kvs_handle *)0x0;
        pfVar11 = (fdb_kvs_handle *)&(pfVar11->kvs_config).field_0x1;
        pfStack_1798 = (fdb_iterator *)0x11459c;
        pfVar17 = (fdb_iterator *)auStack_1778._0_8_;
        fVar4 = fdb_iterator_next((fdb_iterator *)auStack_1778._0_8_);
        pfVar14 = pfVar13;
      } while (fVar4 == FDB_RESULT_SUCCESS);
      if ((int)pfVar11 == 10) {
        pfStack_1798 = (fdb_iterator *)0x1145b8;
        fdb_iterator_close((fdb_iterator *)auStack_1778._0_8_);
        pfStack_1798 = (fdb_iterator *)0x1145c2;
        fdb_kvs_close(pfStack_1788);
        pfStack_1798 = (fdb_iterator *)0x1145cc;
        fdb_kvs_close(pfStack_1748);
        pfStack_1798 = (fdb_iterator *)0x1145d6;
        fdb_kvs_close(pfStack_1750);
        pfStack_1798 = (fdb_iterator *)0x1145e0;
        fdb_kvs_close(pfStack_1760);
        pfStack_1798 = (fdb_iterator *)0x1145ea;
        fdb_close((fdb_file_handle *)auStack_1778._16_8_);
        lVar18 = 0;
        do {
          pfStack_1798 = (fdb_iterator *)0x1145f6;
          fdb_doc_free(*(fdb_doc **)(auStack_1740 + lVar18 * 8));
          lVar18 = lVar18 + 1;
        } while (lVar18 != 0x14);
        pfStack_1798 = (fdb_iterator *)0x114604;
        fdb_shutdown();
        pfStack_1798 = (fdb_iterator *)0x114609;
        memleak_end();
        pcVar15 = "%s PASSED\n";
        if (snapshot_clone_test()::__test_pass != '\0') {
          pcVar15 = "%s FAILED\n";
        }
        pfStack_1798 = (fdb_iterator *)0x11463a;
        fprintf(_stderr,pcVar15,"snapshot clone test");
        return;
      }
      goto LAB_0011470a;
    }
  }
  else {
LAB_00114698:
    pfStack_1798 = (fdb_iterator *)0x11469d;
    snapshot_clone_test();
LAB_0011469d:
    pfStack_1798 = (fdb_iterator *)0x1146a2;
    snapshot_clone_test();
    pfVar14 = __s;
LAB_001146a2:
    pfStack_1798 = (fdb_iterator *)0x1146a7;
    snapshot_clone_test();
LAB_001146a7:
    pfStack_1798 = (fdb_iterator *)0x1146ac;
    snapshot_clone_test();
LAB_001146ac:
    pfStack_1798 = (fdb_iterator *)0x1146b1;
    snapshot_clone_test();
LAB_001146b1:
    pfStack_1798 = (fdb_iterator *)0x1146b6;
    snapshot_clone_test();
LAB_001146b6:
    pfStack_1798 = (fdb_iterator *)0x1146bb;
    snapshot_clone_test();
LAB_001146bb:
    pfStack_1798 = (fdb_iterator *)0x1146c0;
    snapshot_clone_test();
LAB_001146c0:
    pfStack_1798 = (fdb_iterator *)0x1146c5;
    snapshot_clone_test();
LAB_001146c5:
    pfStack_1798 = (fdb_iterator *)0x1146ca;
    snapshot_clone_test();
LAB_001146ca:
    pfStack_1798 = (fdb_iterator *)0x1146cf;
    snapshot_clone_test();
LAB_001146cf:
    __s = pfVar14;
    doc_01 = pfVar12;
    pfStack_1798 = (fdb_iterator *)0x1146d4;
    snapshot_clone_test();
LAB_001146d4:
    pfStack_1798 = (fdb_iterator *)0x1146df;
    snapshot_clone_test();
LAB_001146df:
    pfStack_1798 = (fdb_iterator *)0x1146ea;
    snapshot_clone_test();
LAB_001146ea:
    pfVar12 = doc_01;
    pfStack_1798 = (fdb_iterator *)0x1146ef;
    snapshot_clone_test();
LAB_001146ef:
    pfStack_1798 = (fdb_iterator *)0x1146fa;
    snapshot_clone_test();
LAB_001146fa:
    pfStack_1798 = (fdb_iterator *)0x114705;
    pfVar17 = config;
    snapshot_clone_test();
  }
  pfStack_1798 = (fdb_iterator *)0x11470a;
  snapshot_clone_test();
LAB_0011470a:
  pfStack_1798 = (fdb_iterator *)snap_clone_thread;
  snapshot_clone_test();
  pfStack_17f0 = (fdb_doc *)0x0;
  pfVar14 = pfVar17->handle;
  iVar5 = *(int *)&pfVar17->seqtree_iterator;
  pfStack_17c0 = pfVar12;
  pfStack_17b8 = __s;
  pfStack_17b0 = pfVar11;
  pfStack_17a8 = pfVar13;
  pfStack_17a0 = config;
  pfStack_1798 = doc_00;
  gettimeofday(&tStack_17d0,(__timezone_ptr_t)0x0);
  fVar4 = fdb_snapshot_open((fdb_kvs_handle *)pfVar17->hbtrie_iterator,&pfStack_17d8,
                            0xffffffffffffffff);
  if (fVar4 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x7d5);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x7d5,"void *snap_clone_thread(void *)");
  }
  lVar18 = 0;
  iStack_17dc = iVar5;
  fdb_iterator_init(pfStack_17d8,&pfStack_17e8,(void *)0x0,0,(void *)0x0,0,0);
  do {
    fVar4 = fdb_iterator_get(pfStack_17e8,&pfStack_17f0);
    doc = pfStack_17f0;
    if (fVar4 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x7df);
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x7df,"void *snap_clone_thread(void *)");
    }
    pvVar1 = pfStack_17f0->key;
    lVar2 = *(long *)(&(pfVar14->kvs_config).create_if_missing + lVar18 * 8);
    pvVar3 = *(void **)(lVar2 + 0x20);
    iVar5 = bcmp(pvVar1,pvVar3,pfStack_17f0->keylen);
    if (iVar5 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar3,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x7e0);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x7e0,"void *snap_clone_thread(void *)");
    }
    pvVar1 = doc->body;
    pvVar3 = *(void **)(lVar2 + 0x40);
    iVar5 = bcmp(pvVar1,pvVar3,doc->bodylen);
    if (iVar5 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar3,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x7e1);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x7e1,"void *snap_clone_thread(void *)");
    }
    fdb_doc_free(doc);
    pfStack_17f0 = (fdb_doc *)0x0;
    lVar18 = lVar18 + 1;
    fVar4 = fdb_iterator_next(pfStack_17e8);
  } while (fVar4 == FDB_RESULT_SUCCESS);
  if (iStack_17dc / 2 == (int)lVar18) {
    fdb_iterator_close(pfStack_17e8);
    fdb_kvs_close(pfStack_17d8);
    pthread_exit((void *)0x0);
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
          ,0x7e9);
  __assert_fail("count==n/2",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x7e9,"void *snap_clone_thread(void *)");
}

Assistant:

void in_memory_snapshot_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 20;
    int count;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_kvs_handle *snap_db;
    fdb_seqnum_t snap_seq;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc;
    fdb_kvs_info kvs_info;
    fdb_status status;
    fdb_iterator *iterator;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous mvcc_test files
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;

    // remove previous mvcc_test files
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    // open db
    status = fdb_open(&dbfile, "./mvcc_test1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Create a snapshot from an empty database file
    status = fdb_snapshot_open(db, &snap_db, 0);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    // check if snapshot's sequence number is zero.
    fdb_get_kvs_info(snap_db, &kvs_info);
    TEST_CHK(kvs_info.last_seqnum == 0);
    // create an iterator on the snapshot for full range
    fdb_iterator_init(snap_db, &iterator, NULL, 0, NULL, 0, FDB_ITR_NONE);
    // Iterator should not return any items.
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_ITERATOR_FAIL);
    fdb_iterator_close(iterator);
    fdb_kvs_close(snap_db);

    // ------- Setup test ----------------------------------
    // insert documents of 0-4
    for (i=0; i<n/4; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    // commit with a manual WAL flush (these docs go into HB-trie)
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // insert documents from 5 - 8
    for (; i < n/2 - 1; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    // We want to create:
    // |WALFlushHDR|Key-Value1|HDR|Key-Value2|SnapshotHDR|Key-Value1|HDR|
    // Insert doc 9 with a different value to test duplicate elimination..
    sprintf(keybuf, "key%d", i);
    sprintf(metabuf, "meta%d", i);
    sprintf(bodybuf, "Body%d", i);
    fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
    fdb_set(db, doc[i]);

    // commit again without a WAL flush (last doc goes into the AVL tree)
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // Insert doc 9 now again with expected value..
    *(char *)doc[i]->body = 'b';
    fdb_set(db, doc[i]);

    // TAKE SNAPSHOT: pick up sequence number of a commit without a WAL flush
    snap_seq = doc[i]->seqnum;

    // Creation of a snapshot with a sequence number that was taken WITHOUT a
    // commit must fail even if it from the latest document that was set...
    fdb_get_kvs_info(db, &kvs_info);
    status = fdb_snapshot_open(db, &snap_db, kvs_info.last_seqnum);
    TEST_CHK(status == FDB_RESULT_NO_DB_INSTANCE);

    // ---------- Snapshot tests begin -----------------------
    // Initialize an in-memory snapshot Without a Commit...
    // WAL items are not flushed...
    status = fdb_snapshot_open(db, &snap_db, FDB_SNAPSHOT_INMEM);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // commit again without a WAL flush (these documents go into the AVL trees)
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // Now re-insert doc 9 as another duplicate (only newer sequence number)
    fdb_set(db, doc[i]);

    // commit again without a WAL flush (last doc goes into the AVL tree)
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // insert documents from 10-14 into HB-trie
    for (++i; i < (n/2 + n/4); i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
                (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "in_memory_snapshot_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // check snapshot's sequence number
    fdb_get_kvs_info(snap_db, &kvs_info);
    TEST_CHK(kvs_info.last_seqnum == snap_seq);

    // insert documents from 15 - 19 on file into the WAL
    for (; i < n; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }
    // commit without a WAL flush (This WAL must not affect snapshot)
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // create an iterator on the snapshot for full range
    fdb_iterator_init(snap_db, &iterator, NULL, 0, NULL, 0, FDB_ITR_NONE);

    // repeat until fail
    i=0;
    count=0;
    rdoc = NULL;
    do {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
        TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);

        fdb_doc_free(rdoc);
        rdoc = NULL;
        i++;
        count++;
    } while (fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);

    TEST_CHK(count==n/2); // Only unique items from the first half

    fdb_iterator_close(iterator);

    // close db handle
    fdb_kvs_close(db);
    // close snapshot handle
    fdb_kvs_close(snap_db);

    // close db file
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("in-memory snapshot test");
}